

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  undefined1 auVar6 [16];
  Primitive PVar7;
  uint uVar8;
  undefined4 uVar9;
  Geometry *pGVar10;
  __int_type_conflict _Var11;
  long lVar12;
  long lVar13;
  RTCRayQueryContext *pRVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [12];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  byte bVar83;
  byte bVar84;
  byte bVar85;
  ulong uVar86;
  byte bVar87;
  uint uVar88;
  byte bVar89;
  byte bVar90;
  long lVar91;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  ulong uVar92;
  long lVar93;
  bool bVar94;
  ulong uVar95;
  uint uVar96;
  uint uVar153;
  uint uVar154;
  uint uVar156;
  uint uVar157;
  uint uVar158;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  uint uVar155;
  uint uVar159;
  undefined1 auVar146 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar147 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar152 [32];
  float pp;
  float fVar160;
  float fVar161;
  undefined4 uVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar225;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar223;
  float fVar224;
  undefined1 auVar222 [64];
  float fVar226;
  float fVar227;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar251;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar252;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  float fVar258;
  float fVar259;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar260;
  undefined1 auVar257 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar264 [64];
  float fVar268;
  undefined1 auVar269 [64];
  float fVar271;
  undefined1 auVar270 [32];
  undefined1 auVar274 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar275 [64];
  undefined1 auVar276 [32];
  undefined1 auVar277 [64];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  undefined1 auVar280 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 (*local_918) [32];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  ulong local_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar148 [32];
  undefined1 auVar151 [32];
  
  PVar7 = prim[1];
  uVar95 = (ulong)(byte)PVar7;
  lVar93 = uVar95 * 0x25;
  fVar227 = *(float *)(prim + lVar93 + 0x12);
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar97 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar102 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar104 = vsubps_avx(auVar97,*(undefined1 (*) [16])(prim + lVar93 + 6));
  fVar226 = fVar227 * auVar104._0_4_;
  fVar160 = fVar227 * auVar102._0_4_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar95 * 4 + 6);
  auVar112 = vpmovsxbd_avx2(auVar97);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar95 * 5 + 6);
  auVar111 = vpmovsxbd_avx2(auVar23);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar95 * 6 + 6);
  auVar114 = vpmovsxbd_avx2(auVar107);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar95 * 0xf + 6);
  auVar115 = vpmovsxbd_avx2(auVar100);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar120 = vpmovsxbd_avx2(auVar101);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar116 = vcvtdq2ps_avx(auVar120);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar95 + 6);
  auVar113 = vpmovsxbd_avx2(auVar99);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar95 * 0x1a + 6);
  auVar117 = vpmovsxbd_avx2(auVar6);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar95 * 0x1b + 6);
  auVar118 = vpmovsxbd_avx2(auVar98);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar95 * 0x1c + 6);
  auVar110 = vpmovsxbd_avx2(auVar103);
  auVar119 = vcvtdq2ps_avx(auVar110);
  auVar127._4_4_ = fVar160;
  auVar127._0_4_ = fVar160;
  auVar127._8_4_ = fVar160;
  auVar127._12_4_ = fVar160;
  auVar127._16_4_ = fVar160;
  auVar127._20_4_ = fVar160;
  auVar127._24_4_ = fVar160;
  auVar127._28_4_ = fVar160;
  auVar218._8_4_ = 1;
  auVar218._0_8_ = 0x100000001;
  auVar218._12_4_ = 1;
  auVar218._16_4_ = 1;
  auVar218._20_4_ = 1;
  auVar218._24_4_ = 1;
  auVar218._28_4_ = 1;
  auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar122 = ZEXT1632(CONCAT412(fVar227 * auVar102._12_4_,
                                CONCAT48(fVar227 * auVar102._8_4_,
                                         CONCAT44(fVar227 * auVar102._4_4_,fVar160))));
  auVar121 = vpermps_avx2(auVar218,auVar122);
  auVar109 = vpermps_avx512vl(auVar108,auVar122);
  fVar258 = auVar109._0_4_;
  fVar259 = auVar109._4_4_;
  auVar122._4_4_ = fVar259 * auVar114._4_4_;
  auVar122._0_4_ = fVar258 * auVar114._0_4_;
  fVar260 = auVar109._8_4_;
  auVar122._8_4_ = fVar260 * auVar114._8_4_;
  fVar265 = auVar109._12_4_;
  auVar122._12_4_ = fVar265 * auVar114._12_4_;
  fVar266 = auVar109._16_4_;
  auVar122._16_4_ = fVar266 * auVar114._16_4_;
  fVar267 = auVar109._20_4_;
  auVar122._20_4_ = fVar267 * auVar114._20_4_;
  fVar185 = auVar109._24_4_;
  auVar122._24_4_ = fVar185 * auVar114._24_4_;
  auVar122._28_4_ = auVar120._28_4_;
  auVar120._4_4_ = auVar113._4_4_ * fVar259;
  auVar120._0_4_ = auVar113._0_4_ * fVar258;
  auVar120._8_4_ = auVar113._8_4_ * fVar260;
  auVar120._12_4_ = auVar113._12_4_ * fVar265;
  auVar120._16_4_ = auVar113._16_4_ * fVar266;
  auVar120._20_4_ = auVar113._20_4_ * fVar267;
  auVar120._24_4_ = auVar113._24_4_ * fVar185;
  auVar120._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = auVar119._4_4_ * fVar259;
  auVar110._0_4_ = auVar119._0_4_ * fVar258;
  auVar110._8_4_ = auVar119._8_4_ * fVar260;
  auVar110._12_4_ = auVar119._12_4_ * fVar265;
  auVar110._16_4_ = auVar119._16_4_ * fVar266;
  auVar110._20_4_ = auVar119._20_4_ * fVar267;
  auVar110._24_4_ = auVar119._24_4_ * fVar185;
  auVar110._28_4_ = auVar109._28_4_;
  auVar97 = vfmadd231ps_fma(auVar122,auVar121,auVar111);
  auVar23 = vfmadd231ps_fma(auVar120,auVar121,auVar116);
  auVar107 = vfmadd231ps_fma(auVar110,auVar118,auVar121);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar127,auVar112);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar127,auVar115);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar117,auVar127);
  auVar201._4_4_ = fVar226;
  auVar201._0_4_ = fVar226;
  auVar201._8_4_ = fVar226;
  auVar201._12_4_ = fVar226;
  auVar201._16_4_ = fVar226;
  auVar201._20_4_ = fVar226;
  auVar201._24_4_ = fVar226;
  auVar201._28_4_ = fVar226;
  auVar110 = ZEXT1632(CONCAT412(fVar227 * auVar104._12_4_,
                                CONCAT48(fVar227 * auVar104._8_4_,
                                         CONCAT44(fVar227 * auVar104._4_4_,fVar226))));
  auVar120 = vpermps_avx2(auVar218,auVar110);
  auVar110 = vpermps_avx512vl(auVar108,auVar110);
  fVar227 = auVar110._0_4_;
  fVar258 = auVar110._4_4_;
  auVar121._4_4_ = fVar258 * auVar114._4_4_;
  auVar121._0_4_ = fVar227 * auVar114._0_4_;
  fVar259 = auVar110._8_4_;
  auVar121._8_4_ = fVar259 * auVar114._8_4_;
  fVar260 = auVar110._12_4_;
  auVar121._12_4_ = fVar260 * auVar114._12_4_;
  fVar265 = auVar110._16_4_;
  auVar121._16_4_ = fVar265 * auVar114._16_4_;
  fVar266 = auVar110._20_4_;
  auVar121._20_4_ = fVar266 * auVar114._20_4_;
  fVar267 = auVar110._24_4_;
  auVar121._24_4_ = fVar267 * auVar114._24_4_;
  auVar121._28_4_ = fVar160;
  auVar108._4_4_ = auVar113._4_4_ * fVar258;
  auVar108._0_4_ = auVar113._0_4_ * fVar227;
  auVar108._8_4_ = auVar113._8_4_ * fVar259;
  auVar108._12_4_ = auVar113._12_4_ * fVar260;
  auVar108._16_4_ = auVar113._16_4_ * fVar265;
  auVar108._20_4_ = auVar113._20_4_ * fVar266;
  auVar108._24_4_ = auVar113._24_4_ * fVar267;
  auVar108._28_4_ = auVar114._28_4_;
  auVar113._4_4_ = auVar119._4_4_ * fVar258;
  auVar113._0_4_ = auVar119._0_4_ * fVar227;
  auVar113._8_4_ = auVar119._8_4_ * fVar259;
  auVar113._12_4_ = auVar119._12_4_ * fVar260;
  auVar113._16_4_ = auVar119._16_4_ * fVar265;
  auVar113._20_4_ = auVar119._20_4_ * fVar266;
  auVar113._24_4_ = auVar119._24_4_ * fVar267;
  auVar113._28_4_ = auVar110._28_4_;
  auVar100 = vfmadd231ps_fma(auVar121,auVar120,auVar111);
  auVar101 = vfmadd231ps_fma(auVar108,auVar120,auVar116);
  auVar99 = vfmadd231ps_fma(auVar113,auVar120,auVar118);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar201,auVar112);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar201,auVar115);
  auVar129._8_4_ = 0x7fffffff;
  auVar129._0_8_ = 0x7fffffff7fffffff;
  auVar129._12_4_ = 0x7fffffff;
  auVar129._16_4_ = 0x7fffffff;
  auVar129._20_4_ = 0x7fffffff;
  auVar129._24_4_ = 0x7fffffff;
  auVar129._28_4_ = 0x7fffffff;
  auVar105 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar201,auVar117);
  auVar112 = vandps_avx(ZEXT1632(auVar97),auVar129);
  auVar131._8_4_ = 0x219392ef;
  auVar131._0_8_ = 0x219392ef219392ef;
  auVar131._12_4_ = 0x219392ef;
  auVar131._16_4_ = 0x219392ef;
  auVar131._20_4_ = 0x219392ef;
  auVar131._24_4_ = 0x219392ef;
  auVar131._28_4_ = 0x219392ef;
  uVar86 = vcmpps_avx512vl(auVar112,auVar131,1);
  bVar16 = (bool)((byte)uVar86 & 1);
  auVar109._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar97._0_4_;
  bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar109._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar97._4_4_;
  bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar109._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar97._8_4_;
  bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar109._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar97._12_4_;
  auVar109._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar109._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar109._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar109._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar23),auVar129);
  uVar86 = vcmpps_avx512vl(auVar112,auVar131,1);
  bVar16 = (bool)((byte)uVar86 & 1);
  auVar123._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._0_4_;
  bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._4_4_;
  bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._8_4_;
  bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar23._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar112 = vandps_avx(ZEXT1632(auVar107),auVar129);
  uVar86 = vcmpps_avx512vl(auVar112,auVar131,1);
  bVar16 = (bool)((byte)uVar86 & 1);
  auVar112._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._0_4_;
  bVar16 = (bool)((byte)(uVar86 >> 1) & 1);
  auVar112._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._4_4_;
  bVar16 = (bool)((byte)(uVar86 >> 2) & 1);
  auVar112._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._8_4_;
  bVar16 = (bool)((byte)(uVar86 >> 3) & 1);
  auVar112._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar107._12_4_;
  auVar112._16_4_ = (uint)((byte)(uVar86 >> 4) & 1) * 0x219392ef;
  auVar112._20_4_ = (uint)((byte)(uVar86 >> 5) & 1) * 0x219392ef;
  auVar112._24_4_ = (uint)((byte)(uVar86 >> 6) & 1) * 0x219392ef;
  auVar112._28_4_ = (uint)(byte)(uVar86 >> 7) * 0x219392ef;
  auVar111 = vrcp14ps_avx512vl(auVar109);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = &DAT_3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar130._16_4_ = 0x3f800000;
  auVar130._20_4_ = 0x3f800000;
  auVar130._24_4_ = 0x3f800000;
  auVar130._28_4_ = 0x3f800000;
  auVar97 = vfnmadd213ps_fma(auVar109,auVar111,auVar130);
  auVar97 = vfmadd132ps_fma(ZEXT1632(auVar97),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar123);
  auVar23 = vfnmadd213ps_fma(auVar123,auVar111,auVar130);
  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar111,auVar111);
  auVar111 = vrcp14ps_avx512vl(auVar112);
  auVar107 = vfnmadd213ps_fma(auVar112,auVar111,auVar130);
  auVar107 = vfmadd132ps_fma(ZEXT1632(auVar107),auVar111,auVar111);
  fVar227 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar93 + 0x16)) *
            *(float *)(prim + lVar93 + 0x1a);
  auVar128._4_4_ = fVar227;
  auVar128._0_4_ = fVar227;
  auVar128._8_4_ = fVar227;
  auVar128._12_4_ = fVar227;
  auVar128._16_4_ = fVar227;
  auVar128._20_4_ = fVar227;
  auVar128._24_4_ = fVar227;
  auVar128._28_4_ = fVar227;
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 7 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0xb + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 9 + 6));
  auVar100 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar112 = vcvtdq2ps_avx(auVar114);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0xd + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar101 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x12 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  uVar86 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 2 + uVar86 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar99 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar86 + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x18 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar6 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x1d + 6));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 + (ulong)(byte)PVar7 * 0x20 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar98 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar275 = ZEXT1664(auVar98);
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar7 * 0x20 - uVar95) + 6))
  ;
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar95 * 0x23 + 6));
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar111 = vsubps_avx(auVar111,auVar112);
  auVar103 = vfmadd213ps_fma(auVar111,auVar128,auVar112);
  auVar277 = ZEXT1664(auVar103);
  auVar112 = vsubps_avx(ZEXT1632(auVar100),ZEXT1632(auVar102));
  auVar117._4_4_ = auVar97._4_4_ * auVar112._4_4_;
  auVar117._0_4_ = auVar97._0_4_ * auVar112._0_4_;
  auVar117._8_4_ = auVar97._8_4_ * auVar112._8_4_;
  auVar117._12_4_ = auVar97._12_4_ * auVar112._12_4_;
  auVar117._16_4_ = auVar112._16_4_ * 0.0;
  auVar117._20_4_ = auVar112._20_4_ * 0.0;
  auVar117._24_4_ = auVar112._24_4_ * 0.0;
  auVar117._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar102));
  auVar126._0_4_ = auVar97._0_4_ * auVar112._0_4_;
  auVar126._4_4_ = auVar97._4_4_ * auVar112._4_4_;
  auVar126._8_4_ = auVar97._8_4_ * auVar112._8_4_;
  auVar126._12_4_ = auVar97._12_4_ * auVar112._12_4_;
  auVar126._16_4_ = auVar112._16_4_ * 0.0;
  auVar126._20_4_ = auVar112._20_4_ * 0.0;
  auVar126._24_4_ = auVar112._24_4_ * 0.0;
  auVar126._28_4_ = 0;
  auVar112 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar104));
  auVar118._4_4_ = auVar23._4_4_ * auVar112._4_4_;
  auVar118._0_4_ = auVar23._0_4_ * auVar112._0_4_;
  auVar118._8_4_ = auVar23._8_4_ * auVar112._8_4_;
  auVar118._12_4_ = auVar23._12_4_ * auVar112._12_4_;
  auVar118._16_4_ = auVar112._16_4_ * 0.0;
  auVar118._20_4_ = auVar112._20_4_ * 0.0;
  auVar118._24_4_ = auVar112._24_4_ * 0.0;
  auVar118._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar104));
  auVar125._0_4_ = auVar23._0_4_ * auVar112._0_4_;
  auVar125._4_4_ = auVar23._4_4_ * auVar112._4_4_;
  auVar125._8_4_ = auVar23._8_4_ * auVar112._8_4_;
  auVar125._12_4_ = auVar23._12_4_ * auVar112._12_4_;
  auVar125._16_4_ = auVar112._16_4_ * 0.0;
  auVar125._20_4_ = auVar112._20_4_ * 0.0;
  auVar125._24_4_ = auVar112._24_4_ * 0.0;
  auVar125._28_4_ = 0;
  auVar112 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar105));
  auVar119._4_4_ = auVar107._4_4_ * auVar112._4_4_;
  auVar119._0_4_ = auVar107._0_4_ * auVar112._0_4_;
  auVar119._8_4_ = auVar107._8_4_ * auVar112._8_4_;
  auVar119._12_4_ = auVar107._12_4_ * auVar112._12_4_;
  auVar119._16_4_ = auVar112._16_4_ * 0.0;
  auVar119._20_4_ = auVar112._20_4_ * 0.0;
  auVar119._24_4_ = auVar112._24_4_ * 0.0;
  auVar119._28_4_ = auVar112._28_4_;
  auVar112 = vsubps_avx(ZEXT1632(auVar103),ZEXT1632(auVar105));
  auVar124._0_4_ = auVar107._0_4_ * auVar112._0_4_;
  auVar124._4_4_ = auVar107._4_4_ * auVar112._4_4_;
  auVar124._8_4_ = auVar107._8_4_ * auVar112._8_4_;
  auVar124._12_4_ = auVar107._12_4_ * auVar112._12_4_;
  auVar124._16_4_ = auVar112._16_4_ * 0.0;
  auVar124._20_4_ = auVar112._20_4_ * 0.0;
  auVar124._24_4_ = auVar112._24_4_ * 0.0;
  auVar124._28_4_ = 0;
  auVar112 = vpminsd_avx2(auVar117,auVar126);
  auVar111 = vpminsd_avx2(auVar118,auVar125);
  auVar112 = vmaxps_avx(auVar112,auVar111);
  auVar111 = vpminsd_avx2(auVar119,auVar124);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar114._4_4_ = uVar162;
  auVar114._0_4_ = uVar162;
  auVar114._8_4_ = uVar162;
  auVar114._12_4_ = uVar162;
  auVar114._16_4_ = uVar162;
  auVar114._20_4_ = uVar162;
  auVar114._24_4_ = uVar162;
  auVar114._28_4_ = uVar162;
  auVar111 = vmaxps_avx512vl(auVar111,auVar114);
  auVar112 = vmaxps_avx(auVar112,auVar111);
  auVar111._8_4_ = 0x3f7ffffa;
  auVar111._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar111._12_4_ = 0x3f7ffffa;
  auVar111._16_4_ = 0x3f7ffffa;
  auVar111._20_4_ = 0x3f7ffffa;
  auVar111._24_4_ = 0x3f7ffffa;
  auVar111._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar112,auVar111);
  auVar112 = vpmaxsd_avx2(auVar117,auVar126);
  auVar111 = vpmaxsd_avx2(auVar118,auVar125);
  auVar112 = vminps_avx(auVar112,auVar111);
  auVar111 = vpmaxsd_avx2(auVar119,auVar124);
  uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar115._4_4_ = uVar162;
  auVar115._0_4_ = uVar162;
  auVar115._8_4_ = uVar162;
  auVar115._12_4_ = uVar162;
  auVar115._16_4_ = uVar162;
  auVar115._20_4_ = uVar162;
  auVar115._24_4_ = uVar162;
  auVar115._28_4_ = uVar162;
  auVar111 = vminps_avx512vl(auVar111,auVar115);
  auVar112 = vminps_avx(auVar112,auVar111);
  auVar116._8_4_ = 0x3f800003;
  auVar116._0_8_ = 0x3f8000033f800003;
  auVar116._12_4_ = 0x3f800003;
  auVar116._16_4_ = 0x3f800003;
  auVar116._20_4_ = 0x3f800003;
  auVar116._24_4_ = 0x3f800003;
  auVar116._28_4_ = 0x3f800003;
  auVar112 = vmulps_avx512vl(auVar112,auVar116);
  auVar111 = vpbroadcastd_avx512vl();
  uVar26 = vpcmpgtd_avx512vl(auVar111,_DAT_0205a920);
  uVar24 = vcmpps_avx512vl(local_420,auVar112,2);
  if ((byte)((byte)uVar24 & (byte)uVar26) == 0) {
    return;
  }
  local_728 = (ulong)(byte)((byte)uVar24 & (byte)uVar26);
  local_918 = (undefined1 (*) [32])&local_4c0;
  local_660 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_910 = prim;
LAB_01e9bf45:
  lVar93 = 0;
  for (uVar86 = local_728; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
    lVar93 = lVar93 + 1;
  }
  uVar88 = *(uint *)(prim + 2);
  uVar8 = *(uint *)(prim + lVar93 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar88].ptr;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           (ulong)uVar8 *
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar227 = (pGVar10->time_range).lower;
  fVar227 = pGVar10->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar227) / ((pGVar10->time_range).upper - fVar227));
  auVar97 = vroundss_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),9);
  auVar97 = vminss_avx(auVar97,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar97 = vmaxss_avx(ZEXT816(0) << 0x20,auVar97);
  fVar227 = fVar227 - auVar97._0_4_;
  _Var11 = pGVar10[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar91 = (long)(int)auVar97._0_4_ * 0x38;
  lVar93 = *(long *)(_Var11 + 0x10 + lVar91);
  lVar12 = *(long *)(_Var11 + 0x38 + lVar91);
  lVar13 = *(long *)(_Var11 + 0x48 + lVar91);
  pfVar5 = (float *)(lVar12 + uVar86 * lVar13);
  auVar106._0_4_ = fVar227 * *pfVar5;
  auVar106._4_4_ = fVar227 * pfVar5[1];
  auVar106._8_4_ = fVar227 * pfVar5[2];
  auVar106._12_4_ = fVar227 * pfVar5[3];
  pfVar5 = (float *)(lVar12 + (uVar86 + 1) * lVar13);
  auVar228._0_4_ = fVar227 * *pfVar5;
  auVar228._4_4_ = fVar227 * pfVar5[1];
  auVar228._8_4_ = fVar227 * pfVar5[2];
  auVar228._12_4_ = fVar227 * pfVar5[3];
  pfVar5 = (float *)(lVar12 + (uVar86 + 2) * lVar13);
  auVar239._0_4_ = fVar227 * *pfVar5;
  auVar239._4_4_ = fVar227 * pfVar5[1];
  auVar239._8_4_ = fVar227 * pfVar5[2];
  auVar239._12_4_ = fVar227 * pfVar5[3];
  pfVar5 = (float *)(lVar12 + lVar13 * (uVar86 + 3));
  auVar105._0_4_ = fVar227 * *pfVar5;
  auVar105._4_4_ = fVar227 * pfVar5[1];
  auVar105._8_4_ = fVar227 * pfVar5[2];
  auVar105._12_4_ = fVar227 * pfVar5[3];
  lVar12 = *(long *)(_Var11 + lVar91);
  fVar227 = 1.0 - fVar227;
  auVar104._4_4_ = fVar227;
  auVar104._0_4_ = fVar227;
  auVar104._8_4_ = fVar227;
  auVar104._12_4_ = fVar227;
  auVar107 = vfmadd231ps_fma(auVar106,auVar104,*(undefined1 (*) [16])(lVar12 + lVar93 * uVar86));
  auVar100 = vfmadd231ps_fma(auVar228,auVar104,
                             *(undefined1 (*) [16])(lVar12 + lVar93 * (uVar86 + 1)));
  auVar101 = vfmadd231ps_fma(auVar239,auVar104,
                             *(undefined1 (*) [16])(lVar12 + lVar93 * (uVar86 + 2)));
  auVar99 = vfmadd231ps_fma(auVar105,auVar104,*(undefined1 (*) [16])(lVar12 + lVar93 * (uVar86 + 3))
                           );
  auVar97 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar23 = vinsertps_avx(auVar97,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_5c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_8e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar280 = ZEXT3264(local_8e0);
  auVar97 = vunpcklps_avx512vl(local_5c0._0_16_,local_8e0._0_16_);
  local_900 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar279 = ZEXT3264(local_900);
  auVar104 = local_900._0_16_;
  local_870 = vinsertps_avx512f(auVar97,auVar104,0x28);
  auVar264 = ZEXT1664(local_870);
  auVar253._0_4_ = auVar107._0_4_ + auVar100._0_4_ + auVar101._0_4_ + auVar99._0_4_;
  auVar253._4_4_ = auVar107._4_4_ + auVar100._4_4_ + auVar101._4_4_ + auVar99._4_4_;
  auVar253._8_4_ = auVar107._8_4_ + auVar100._8_4_ + auVar101._8_4_ + auVar99._8_4_;
  auVar253._12_4_ = auVar107._12_4_ + auVar100._12_4_ + auVar101._12_4_ + auVar99._12_4_;
  auVar102._8_4_ = 0x3e800000;
  auVar102._0_8_ = 0x3e8000003e800000;
  auVar102._12_4_ = 0x3e800000;
  auVar97 = vmulps_avx512vl(auVar253,auVar102);
  auVar97 = vsubps_avx(auVar97,auVar23);
  auVar97 = vdpps_avx(auVar97,local_870,0x7f);
  fVar227 = *(float *)(ray + k * 4 + 0x60);
  auVar269 = ZEXT464((uint)fVar227);
  local_880 = vdpps_avx(local_870,local_870,0x7f);
  auVar103 = ZEXT816(0) << 0x40;
  auVar263 = ZEXT1664(auVar103);
  auVar255._4_12_ = ZEXT812(0) << 0x20;
  auVar255._0_4_ = local_880._0_4_;
  auVar98 = vrcp14ss_avx512f(auVar103,auVar255);
  auVar6 = vfnmadd213ss_fma(auVar98,local_880,ZEXT416(0x40000000));
  local_400 = auVar97._0_4_ * auVar98._0_4_ * auVar6._0_4_;
  auVar254 = ZEXT464((uint)local_400);
  auVar256._4_4_ = local_400;
  auVar256._0_4_ = local_400;
  auVar256._8_4_ = local_400;
  auVar256._12_4_ = local_400;
  fStack_6f0 = local_400;
  _local_700 = auVar256;
  fStack_6ec = local_400;
  fStack_6e8 = local_400;
  fStack_6e4 = local_400;
  auVar97 = vfmadd231ps_fma(auVar23,local_870,auVar256);
  auVar97 = vblendps_avx(auVar97,auVar103,8);
  auVar23 = vsubps_avx(auVar107,auVar97);
  auVar107 = vsubps_avx(auVar101,auVar97);
  auVar100 = vsubps_avx(auVar100,auVar97);
  auVar97 = vsubps_avx(auVar99,auVar97);
  local_1e0 = auVar23._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar133._8_4_ = 1;
  auVar133._0_8_ = 0x100000001;
  auVar133._12_4_ = 1;
  auVar133._16_4_ = 1;
  auVar133._20_4_ = 1;
  auVar133._24_4_ = 1;
  auVar133._28_4_ = 1;
  local_800 = ZEXT1632(auVar23);
  local_200 = vpermps_avx2(auVar133,local_800);
  auVar136._8_4_ = 2;
  auVar136._0_8_ = 0x200000002;
  auVar136._12_4_ = 2;
  auVar136._16_4_ = 2;
  auVar136._20_4_ = 2;
  auVar136._24_4_ = 2;
  auVar136._28_4_ = 2;
  local_220 = vpermps_avx2(auVar136,local_800);
  auVar137._8_4_ = 3;
  auVar137._0_8_ = 0x300000003;
  auVar137._12_4_ = 3;
  auVar137._16_4_ = 3;
  auVar137._20_4_ = 3;
  auVar137._24_4_ = 3;
  auVar137._28_4_ = 3;
  local_240 = vpermps_avx2(auVar137,local_800);
  local_260 = auVar100._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_840 = ZEXT1632(auVar100);
  local_280 = vpermps_avx2(auVar133,local_840);
  local_2a0 = vpermps_avx2(auVar136,local_840);
  local_2c0 = vpermps_avx2(auVar137,local_840);
  local_2e0 = auVar107._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_820 = ZEXT1632(auVar107);
  local_300 = vpermps_avx2(auVar133,local_820);
  local_320 = vpermps_avx2(auVar136,local_820);
  local_340 = vpermps_avx2(auVar137,local_820);
  local_360 = auVar97._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_860 = ZEXT1632(auVar97);
  local_380 = vpermps_avx2(auVar133,_local_860);
  local_3a0 = vpermps_avx2(auVar136,_local_860);
  local_3c0 = vpermps_avx2(auVar137,_local_860);
  auVar97 = vmulss_avx512f(auVar104,auVar104);
  auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar97),local_8e0,local_8e0);
  local_5e0 = vfmadd231ps_avx512vl(auVar112,local_5c0,local_5c0);
  local_3e0._0_4_ = local_5e0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar132._8_4_ = 0x7fffffff;
  auVar132._0_8_ = 0x7fffffff7fffffff;
  auVar132._12_4_ = 0x7fffffff;
  auVar132._16_4_ = 0x7fffffff;
  auVar132._20_4_ = 0x7fffffff;
  auVar132._24_4_ = 0x7fffffff;
  auVar132._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar132);
  local_7a0 = ZEXT416((uint)local_400);
  local_400 = fVar227 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_620 = vpbroadcastd_avx512vl();
  uVar86 = 0;
  local_908 = 1;
  local_640 = vpbroadcastd_avx512vl();
  auVar97 = vsqrtss_avx(local_880,local_880);
  auVar23 = vsqrtss_avx(local_880,local_880);
  auVar222 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar278 = ZEXT3264(auVar112);
  do {
    local_930 = auVar222._0_16_;
    auVar107 = vmovshdup_avx(local_930);
    fVar160 = auVar222._0_4_;
    fVar207 = auVar107._0_4_ - fVar160;
    fVar252 = fVar207 * 0.04761905;
    auVar246._4_4_ = fVar160;
    auVar246._0_4_ = fVar160;
    auVar246._8_4_ = fVar160;
    auVar246._12_4_ = fVar160;
    auVar246._16_4_ = fVar160;
    auVar246._20_4_ = fVar160;
    auVar246._24_4_ = fVar160;
    auVar246._28_4_ = fVar160;
    local_8a0._4_4_ = fVar207;
    local_8a0._0_4_ = fVar207;
    local_8a0._8_4_ = fVar207;
    local_8a0._12_4_ = fVar207;
    local_8a0._16_4_ = fVar207;
    local_8a0._20_4_ = fVar207;
    local_8a0._24_4_ = fVar207;
    local_8a0._28_4_ = fVar207;
    auVar107 = vfmadd231ps_fma(auVar246,local_8a0,_DAT_02020f20);
    auVar111 = vsubps_avx512vl(auVar278._0_32_,ZEXT1632(auVar107));
    fVar160 = auVar111._0_4_;
    fVar259 = auVar111._4_4_;
    fVar265 = auVar111._8_4_;
    fVar267 = auVar111._12_4_;
    fVar226 = auVar111._16_4_;
    fVar251 = auVar111._20_4_;
    fVar268 = auVar111._24_4_;
    fVar161 = fVar160 * fVar160 * fVar160;
    fVar180 = fVar259 * fVar259 * fVar259;
    auVar42._4_4_ = fVar180;
    auVar42._0_4_ = fVar161;
    fVar181 = fVar265 * fVar265 * fVar265;
    auVar42._8_4_ = fVar181;
    fVar182 = fVar267 * fVar267 * fVar267;
    auVar42._12_4_ = fVar182;
    fVar183 = fVar226 * fVar226 * fVar226;
    auVar42._16_4_ = fVar183;
    fVar184 = fVar251 * fVar251 * fVar251;
    auVar42._20_4_ = fVar184;
    fVar186 = fVar268 * fVar268 * fVar268;
    auVar42._24_4_ = fVar186;
    auVar42._28_4_ = fVar207;
    auVar113 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar112 = vmulps_avx512vl(auVar42,auVar113);
    fVar258 = auVar107._0_4_;
    fVar260 = auVar107._4_4_;
    fVar266 = auVar107._8_4_;
    fVar185 = auVar107._12_4_;
    fVar206 = fVar258 * fVar258 * fVar258;
    fVar223 = fVar260 * fVar260 * fVar260;
    fVar224 = fVar266 * fVar266 * fVar266;
    fVar225 = fVar185 * fVar185 * fVar185;
    auVar222._0_28_ = ZEXT1628(CONCAT412(fVar225,CONCAT48(fVar224,CONCAT44(fVar223,fVar206))));
    auVar278._0_4_ = fVar258 * fVar160;
    auVar278._4_4_ = fVar260 * fVar259;
    auVar278._8_4_ = fVar266 * fVar265;
    auVar278._12_4_ = fVar185 * fVar267;
    auVar278._16_4_ = fVar226 * 0.0;
    auVar278._20_4_ = fVar251 * 0.0;
    auVar278._28_36_ = auVar269._28_36_;
    auVar278._24_4_ = fVar268 * 0.0;
    auVar114 = vmulps_avx512vl(auVar222._0_32_,auVar113);
    fVar271 = auVar114._28_4_ + fVar207;
    auVar43._4_4_ = fVar180 * 0.16666667;
    auVar43._0_4_ = fVar161 * 0.16666667;
    auVar43._8_4_ = fVar181 * 0.16666667;
    auVar43._12_4_ = fVar182 * 0.16666667;
    auVar43._16_4_ = fVar183 * 0.16666667;
    auVar43._20_4_ = fVar184 * 0.16666667;
    auVar43._24_4_ = fVar186 * 0.16666667;
    auVar43._28_4_ = fVar271;
    auVar44._4_4_ =
         (auVar278._4_4_ * fVar259 * 12.0 + auVar278._4_4_ * fVar260 * 6.0 +
         fVar223 + auVar112._4_4_) * 0.16666667;
    auVar44._0_4_ =
         (auVar278._0_4_ * fVar160 * 12.0 + auVar278._0_4_ * fVar258 * 6.0 +
         fVar206 + auVar112._0_4_) * 0.16666667;
    auVar44._8_4_ =
         (auVar278._8_4_ * fVar265 * 12.0 + auVar278._8_4_ * fVar266 * 6.0 +
         fVar224 + auVar112._8_4_) * 0.16666667;
    auVar44._12_4_ =
         (auVar278._12_4_ * fVar267 * 12.0 + auVar278._12_4_ * fVar185 * 6.0 +
         fVar225 + auVar112._12_4_) * 0.16666667;
    auVar44._16_4_ =
         (auVar278._16_4_ * fVar226 * 12.0 + auVar278._16_4_ * 0.0 * 6.0 + auVar112._16_4_ + 0.0) *
         0.16666667;
    auVar44._20_4_ =
         (auVar278._20_4_ * fVar251 * 12.0 + auVar278._20_4_ * 0.0 * 6.0 + auVar112._20_4_ + 0.0) *
         0.16666667;
    auVar44._24_4_ =
         (auVar278._24_4_ * fVar268 * 12.0 + auVar278._24_4_ * 0.0 * 6.0 + auVar112._24_4_ + 0.0) *
         0.16666667;
    auVar44._28_4_ = auVar275._28_4_;
    auVar45._4_4_ =
         (auVar114._4_4_ + fVar180 +
         auVar278._4_4_ * fVar260 * 12.0 + auVar278._4_4_ * fVar259 * 6.0) * 0.16666667;
    auVar45._0_4_ =
         (auVar114._0_4_ + fVar161 +
         auVar278._0_4_ * fVar258 * 12.0 + auVar278._0_4_ * fVar160 * 6.0) * 0.16666667;
    auVar45._8_4_ =
         (auVar114._8_4_ + fVar181 +
         auVar278._8_4_ * fVar266 * 12.0 + auVar278._8_4_ * fVar265 * 6.0) * 0.16666667;
    auVar45._12_4_ =
         (auVar114._12_4_ + fVar182 +
         auVar278._12_4_ * fVar185 * 12.0 + auVar278._12_4_ * fVar267 * 6.0) * 0.16666667;
    auVar45._16_4_ =
         (auVar114._16_4_ + fVar183 + auVar278._16_4_ * 0.0 * 12.0 + auVar278._16_4_ * fVar226 * 6.0
         ) * 0.16666667;
    auVar45._20_4_ =
         (auVar114._20_4_ + fVar184 + auVar278._20_4_ * 0.0 * 12.0 + auVar278._20_4_ * fVar251 * 6.0
         ) * 0.16666667;
    auVar45._24_4_ =
         (auVar114._24_4_ + fVar186 + auVar278._24_4_ * 0.0 * 12.0 + auVar278._24_4_ * fVar268 * 6.0
         ) * 0.16666667;
    auVar45._28_4_ = auVar277._28_4_;
    auVar46._28_4_ = fVar271 + auVar275._28_4_ + auVar254._28_4_;
    auVar46._0_28_ =
         ZEXT1628(CONCAT412(fVar225 * 0.16666667,
                            CONCAT48(fVar224 * 0.16666667,
                                     CONCAT44(fVar223 * 0.16666667,fVar206 * 0.16666667))));
    auVar79._4_4_ = uStack_35c;
    auVar79._0_4_ = local_360;
    auVar79._8_4_ = uStack_358;
    auVar79._12_4_ = uStack_354;
    auVar79._16_4_ = uStack_350;
    auVar79._20_4_ = uStack_34c;
    auVar79._24_4_ = uStack_348;
    auVar79._28_4_ = uStack_344;
    auVar112 = vmulps_avx512vl(auVar79,auVar46);
    auVar114 = vmulps_avx512vl(local_380,auVar46);
    auVar115 = vmulps_avx512vl(local_3a0,auVar46);
    auVar116 = vmulps_avx512vl(local_3c0,auVar46);
    auVar80._4_4_ = uStack_2dc;
    auVar80._0_4_ = local_2e0;
    auVar80._8_4_ = uStack_2d8;
    auVar80._12_4_ = uStack_2d4;
    auVar80._16_4_ = uStack_2d0;
    auVar80._20_4_ = uStack_2cc;
    auVar80._24_4_ = uStack_2c8;
    auVar80._28_4_ = uStack_2c4;
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar45,auVar80);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar45,local_300);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar45,local_320);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_340,auVar45);
    auVar81._4_4_ = uStack_25c;
    auVar81._0_4_ = local_260;
    auVar81._8_4_ = uStack_258;
    auVar81._12_4_ = uStack_254;
    auVar81._16_4_ = uStack_250;
    auVar81._20_4_ = uStack_24c;
    auVar81._24_4_ = uStack_248;
    auVar81._28_4_ = uStack_244;
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar44,auVar81);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar44,local_280);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar44,local_2a0);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_2c0,auVar44);
    auVar82._4_4_ = uStack_1dc;
    auVar82._0_4_ = local_1e0;
    auVar82._8_4_ = uStack_1d8;
    auVar82._12_4_ = uStack_1d4;
    auVar82._16_4_ = uStack_1d0;
    auVar82._20_4_ = uStack_1cc;
    auVar82._24_4_ = uStack_1c8;
    auVar82._28_4_ = uStack_1c4;
    auVar107 = vfmadd231ps_fma(auVar112,auVar43,auVar82);
    auVar100 = vfmadd231ps_fma(auVar114,auVar43,local_200);
    local_8c0 = vfmadd231ps_avx512vl(auVar115,auVar43,local_220);
    auVar101 = vfmadd231ps_fma(auVar116,local_240,auVar43);
    auVar247._0_4_ = -fVar258 * fVar258;
    auVar247._4_4_ = -fVar260 * fVar260;
    auVar247._8_4_ = -fVar266 * fVar266;
    auVar247._12_4_ = -fVar185 * fVar185;
    auVar247._16_4_ = 0x80000000;
    auVar247._20_4_ = 0x80000000;
    auVar247._24_4_ = 0x80000000;
    auVar247._28_4_ = 0;
    auVar114 = vmulps_avx512vl(auVar278._0_32_,auVar113);
    auVar112 = vsubps_avx(auVar247,auVar114);
    auVar47._4_4_ = -fVar259 * fVar259 * 0.5;
    auVar47._0_4_ = -fVar160 * fVar160 * 0.5;
    auVar47._8_4_ = -fVar265 * fVar265 * 0.5;
    auVar47._12_4_ = -fVar267 * fVar267 * 0.5;
    auVar47._16_4_ = -fVar226 * fVar226 * 0.5;
    auVar47._20_4_ = -fVar251 * fVar251 * 0.5;
    auVar47._24_4_ = -fVar268 * fVar268 * 0.5;
    auVar47._28_4_ = auVar111._28_4_;
    auVar48._4_4_ = auVar112._4_4_ * 0.5;
    auVar48._0_4_ = auVar112._0_4_ * 0.5;
    auVar48._8_4_ = auVar112._8_4_ * 0.5;
    auVar48._12_4_ = auVar112._12_4_ * 0.5;
    auVar48._16_4_ = auVar112._16_4_ * 0.5;
    auVar48._20_4_ = auVar112._20_4_ * 0.5;
    auVar48._24_4_ = auVar112._24_4_ * 0.5;
    auVar48._28_4_ = auVar112._28_4_;
    auVar49._4_4_ = (fVar259 * fVar259 + auVar114._4_4_) * 0.5;
    auVar49._0_4_ = (fVar160 * fVar160 + auVar114._0_4_) * 0.5;
    auVar49._8_4_ = (fVar265 * fVar265 + auVar114._8_4_) * 0.5;
    auVar49._12_4_ = (fVar267 * fVar267 + auVar114._12_4_) * 0.5;
    auVar49._16_4_ = (fVar226 * fVar226 + auVar114._16_4_) * 0.5;
    auVar49._20_4_ = (fVar251 * fVar251 + auVar114._20_4_) * 0.5;
    auVar49._24_4_ = (fVar268 * fVar268 + auVar114._24_4_) * 0.5;
    auVar49._28_4_ = auVar263._28_4_ + auVar114._28_4_;
    auVar50._28_4_ = auVar264._28_4_;
    auVar50._0_28_ =
         ZEXT1628(CONCAT412(fVar185 * fVar185 * 0.5,
                            CONCAT48(fVar266 * fVar266 * 0.5,
                                     CONCAT44(fVar260 * fVar260 * 0.5,fVar258 * fVar258 * 0.5))));
    auVar112 = vmulps_avx512vl(auVar79,auVar50);
    auVar111 = vmulps_avx512vl(local_380,auVar50);
    auVar114 = vmulps_avx512vl(local_3a0,auVar50);
    auVar115 = vmulps_avx512vl(local_3c0,auVar50);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar49,auVar80);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar49,local_300);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar49,local_320);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_340,auVar49);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar48,auVar81);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar48,local_280);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar48,local_2a0);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_2c0,auVar48);
    auVar99 = vfmadd231ps_fma(auVar112,auVar47,auVar82);
    auVar6 = vfmadd231ps_fma(auVar111,auVar47,local_200);
    auVar201 = ZEXT1632(auVar100);
    auVar98 = vfmadd231ps_fma(auVar114,auVar47,local_220);
    auVar103 = vfmadd231ps_fma(auVar115,local_240,auVar47);
    auVar51._4_4_ = auVar99._4_4_ * fVar252;
    auVar51._0_4_ = auVar99._0_4_ * fVar252;
    auVar51._8_4_ = auVar99._8_4_ * fVar252;
    auVar51._12_4_ = auVar99._12_4_ * fVar252;
    auVar51._16_4_ = fVar252 * 0.0;
    auVar51._20_4_ = fVar252 * 0.0;
    auVar51._24_4_ = fVar252 * 0.0;
    auVar51._28_4_ = 0x80000000;
    auVar274._0_4_ = auVar6._0_4_ * fVar252;
    auVar274._4_4_ = auVar6._4_4_ * fVar252;
    auVar274._8_4_ = auVar6._8_4_ * fVar252;
    auVar274._12_4_ = auVar6._12_4_ * fVar252;
    auVar274._16_4_ = fVar252 * 0.0;
    auVar274._20_4_ = fVar252 * 0.0;
    auVar274._24_4_ = fVar252 * 0.0;
    auVar274._28_4_ = 0;
    auVar275 = ZEXT3264(auVar274);
    auVar276._0_4_ = auVar98._0_4_ * fVar252;
    auVar276._4_4_ = auVar98._4_4_ * fVar252;
    auVar276._8_4_ = auVar98._8_4_ * fVar252;
    auVar276._12_4_ = auVar98._12_4_ * fVar252;
    auVar276._16_4_ = fVar252 * 0.0;
    auVar276._20_4_ = fVar252 * 0.0;
    auVar276._24_4_ = fVar252 * 0.0;
    auVar276._28_4_ = 0;
    auVar277 = ZEXT3264(auVar276);
    fVar160 = auVar103._0_4_ * fVar252;
    fVar258 = auVar103._4_4_ * fVar252;
    auVar52._4_4_ = fVar258;
    auVar52._0_4_ = fVar160;
    fVar259 = auVar103._8_4_ * fVar252;
    auVar52._8_4_ = fVar259;
    fVar260 = auVar103._12_4_ * fVar252;
    auVar52._12_4_ = fVar260;
    auVar52._16_4_ = fVar252 * 0.0;
    auVar52._20_4_ = fVar252 * 0.0;
    auVar52._24_4_ = fVar252 * 0.0;
    auVar52._28_4_ = local_200._28_4_;
    auVar99 = vxorps_avx512vl(auVar280._0_16_,auVar280._0_16_);
    auVar117 = vpermt2ps_avx512vl(ZEXT1632(auVar107),_DAT_0205fd20,ZEXT1632(auVar99));
    auVar263 = ZEXT3264(auVar117);
    auVar118 = vpermt2ps_avx512vl(auVar201,_DAT_0205fd20,ZEXT1632(auVar99));
    auVar264 = ZEXT3264(auVar118);
    auVar114 = ZEXT1632(auVar99);
    auVar119 = vpermt2ps_avx512vl(local_8c0,_DAT_0205fd20,auVar114);
    auVar269 = ZEXT3264(auVar119);
    auVar248._0_4_ = fVar160 + auVar101._0_4_;
    auVar248._4_4_ = fVar258 + auVar101._4_4_;
    auVar248._8_4_ = fVar259 + auVar101._8_4_;
    auVar248._12_4_ = fVar260 + auVar101._12_4_;
    auVar248._16_4_ = fVar252 * 0.0 + 0.0;
    auVar248._20_4_ = fVar252 * 0.0 + 0.0;
    auVar248._24_4_ = fVar252 * 0.0 + 0.0;
    auVar248._28_4_ = local_200._28_4_ + 0.0;
    auVar112 = vmaxps_avx(ZEXT1632(auVar101),auVar248);
    auVar111 = vminps_avx(ZEXT1632(auVar101),auVar248);
    auVar120 = vpermt2ps_avx512vl(ZEXT1632(auVar101),_DAT_0205fd20,auVar114);
    auVar110 = vpermt2ps_avx512vl(auVar51,_DAT_0205fd20,auVar114);
    auVar121 = vpermt2ps_avx512vl(auVar274,_DAT_0205fd20,auVar114);
    auVar132 = ZEXT1632(auVar99);
    auVar122 = vpermt2ps_avx512vl(auVar276,_DAT_0205fd20,auVar132);
    auVar114 = vpermt2ps_avx512vl(auVar52,_DAT_0205fd20,auVar132);
    auVar108 = vsubps_avx512vl(auVar120,auVar114);
    auVar114 = vsubps_avx(auVar117,ZEXT1632(auVar107));
    auVar115 = vsubps_avx(auVar118,ZEXT1632(auVar100));
    auVar109 = vsubps_avx512vl(auVar119,local_8c0);
    auVar254 = ZEXT3264(auVar109);
    auVar116 = vmulps_avx512vl(auVar115,auVar276);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar274,auVar109);
    auVar123 = vmulps_avx512vl(auVar109,auVar51);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar276,auVar114);
    auVar124 = vmulps_avx512vl(auVar114,auVar274);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar51,auVar115);
    auVar124 = vmulps_avx512vl(auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar109,auVar109);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar124 = vfmadd231ps_avx512vl(auVar116,auVar114,auVar114);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar126 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar116);
    auVar125 = vfmadd132ps_avx512vl(auVar126,auVar125,auVar125);
    auVar123 = vmulps_avx512vl(auVar123,auVar125);
    auVar126 = vmulps_avx512vl(auVar115,auVar122);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar121,auVar109);
    auVar127 = vmulps_avx512vl(auVar109,auVar110);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar122,auVar114);
    auVar128 = vmulps_avx512vl(auVar114,auVar121);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar110,auVar115);
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vmulps_avx512vl(auVar126,auVar125);
    auVar123 = vmaxps_avx512vl(auVar123,auVar125);
    auVar123 = vsqrtps_avx512vl(auVar123);
    auVar125 = vmaxps_avx512vl(auVar108,auVar120);
    auVar112 = vmaxps_avx512vl(auVar112,auVar125);
    auVar125 = vaddps_avx512vl(auVar123,auVar112);
    auVar112 = vminps_avx512vl(auVar108,auVar120);
    auVar112 = vminps_avx(auVar111,auVar112);
    auVar112 = vsubps_avx512vl(auVar112,auVar123);
    auVar138._8_4_ = 0x3f800002;
    auVar138._0_8_ = 0x3f8000023f800002;
    auVar138._12_4_ = 0x3f800002;
    auVar138._16_4_ = 0x3f800002;
    auVar138._20_4_ = 0x3f800002;
    auVar138._24_4_ = 0x3f800002;
    auVar138._28_4_ = 0x3f800002;
    auVar111 = vmulps_avx512vl(auVar125,auVar138);
    auVar139._8_4_ = 0x3f7ffffc;
    auVar139._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar139._12_4_ = 0x3f7ffffc;
    auVar139._16_4_ = 0x3f7ffffc;
    auVar139._20_4_ = 0x3f7ffffc;
    auVar139._24_4_ = 0x3f7ffffc;
    auVar139._28_4_ = 0x3f7ffffc;
    auVar112 = vmulps_avx512vl(auVar112,auVar139);
    auVar53._4_4_ = auVar111._4_4_ * auVar111._4_4_;
    auVar53._0_4_ = auVar111._0_4_ * auVar111._0_4_;
    auVar53._8_4_ = auVar111._8_4_ * auVar111._8_4_;
    auVar53._12_4_ = auVar111._12_4_ * auVar111._12_4_;
    auVar53._16_4_ = auVar111._16_4_ * auVar111._16_4_;
    auVar53._20_4_ = auVar111._20_4_ * auVar111._20_4_;
    auVar53._24_4_ = auVar111._24_4_ * auVar111._24_4_;
    auVar53._28_4_ = auVar112._28_4_;
    auVar111 = vrsqrt14ps_avx512vl(auVar124);
    auVar29._8_4_ = 0xbf000000;
    auVar29._0_8_ = 0xbf000000bf000000;
    auVar29._12_4_ = 0xbf000000;
    auVar29._16_4_ = 0xbf000000;
    auVar29._20_4_ = 0xbf000000;
    auVar29._24_4_ = 0xbf000000;
    auVar29._28_4_ = 0xbf000000;
    auVar120 = vmulps_avx512vl(auVar124,auVar29);
    auVar54._4_4_ = auVar111._4_4_ * auVar120._4_4_;
    auVar54._0_4_ = auVar111._0_4_ * auVar120._0_4_;
    auVar54._8_4_ = auVar111._8_4_ * auVar120._8_4_;
    auVar54._12_4_ = auVar111._12_4_ * auVar120._12_4_;
    auVar54._16_4_ = auVar111._16_4_ * auVar120._16_4_;
    auVar54._20_4_ = auVar111._20_4_ * auVar120._20_4_;
    auVar54._24_4_ = auVar111._24_4_ * auVar120._24_4_;
    auVar54._28_4_ = auVar120._28_4_;
    auVar120 = vmulps_avx512vl(auVar111,auVar111);
    auVar120 = vmulps_avx512vl(auVar120,auVar54);
    auVar30._8_4_ = 0x3fc00000;
    auVar30._0_8_ = 0x3fc000003fc00000;
    auVar30._12_4_ = 0x3fc00000;
    auVar30._16_4_ = 0x3fc00000;
    auVar30._20_4_ = 0x3fc00000;
    auVar30._24_4_ = 0x3fc00000;
    auVar30._28_4_ = 0x3fc00000;
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar111,auVar30);
    auVar55._4_4_ = auVar120._4_4_ * auVar114._4_4_;
    auVar55._0_4_ = auVar120._0_4_ * auVar114._0_4_;
    auVar55._8_4_ = auVar120._8_4_ * auVar114._8_4_;
    auVar55._12_4_ = auVar120._12_4_ * auVar114._12_4_;
    auVar55._16_4_ = auVar120._16_4_ * auVar114._16_4_;
    auVar55._20_4_ = auVar120._20_4_ * auVar114._20_4_;
    auVar55._24_4_ = auVar120._24_4_ * auVar114._24_4_;
    auVar55._28_4_ = auVar111._28_4_;
    auVar111 = vmulps_avx512vl(auVar115,auVar120);
    auVar108 = vmulps_avx512vl(auVar109,auVar120);
    auVar218 = ZEXT1632(auVar107);
    auVar123 = vsubps_avx512vl(auVar132,auVar218);
    auVar124 = vsubps_avx512vl(auVar132,auVar201);
    auVar125 = vsubps_avx512vl(auVar132,local_8c0);
    auVar126 = vmulps_avx512vl(auVar279._0_32_,auVar125);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar280._0_32_,auVar124);
    auVar126 = vfmadd231ps_avx512vl(auVar126,local_5c0,auVar123);
    auVar127 = vmulps_avx512vl(auVar125,auVar125);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar124,auVar124);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar123,auVar123);
    auVar128 = vmulps_avx512vl(auVar279._0_32_,auVar108);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar111,auVar280._0_32_);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar55,local_5c0);
    auVar108 = vmulps_avx512vl(auVar125,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar108,auVar124,auVar111);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar123,auVar55);
    local_960 = vmulps_avx512vl(auVar128,auVar128);
    auVar108 = vsubps_avx512vl(local_3e0,local_960);
    auVar129 = vmulps_avx512vl(auVar128,auVar111);
    auVar126 = vsubps_avx512vl(auVar126,auVar129);
    auVar126 = vaddps_avx512vl(auVar126,auVar126);
    auVar129 = vmulps_avx512vl(auVar111,auVar111);
    auVar127 = vsubps_avx512vl(auVar127,auVar129);
    auVar129 = vsubps_avx512vl(auVar127,auVar53);
    auVar130 = vmulps_avx512vl(auVar126,auVar126);
    auVar113 = vmulps_avx512vl(auVar108,auVar113);
    auVar131 = vmulps_avx512vl(auVar113,auVar129);
    auVar131 = vsubps_avx512vl(auVar130,auVar131);
    uVar95 = vcmpps_avx512vl(auVar131,auVar132,5);
    bVar83 = (byte)uVar95;
    if (bVar83 == 0) {
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar131 = vsqrtps_avx512vl(auVar131);
      auVar132 = vaddps_avx512vl(auVar108,auVar108);
      auVar133 = vrcp14ps_avx512vl(auVar132);
      auVar116 = vfnmadd213ps_avx512vl(auVar132,auVar133,auVar116);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar133,auVar133);
      auVar31._8_4_ = 0x80000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar31._12_4_ = 0x80000000;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar132 = vxorps_avx512vl(auVar126,auVar31);
      auVar132 = vsubps_avx512vl(auVar132,auVar131);
      auVar132 = vmulps_avx512vl(auVar132,auVar116);
      auVar131 = vsubps_avx512vl(auVar131,auVar126);
      auVar116 = vmulps_avx512vl(auVar131,auVar116);
      auVar131 = vfmadd213ps_avx512vl(auVar128,auVar132,auVar111);
      local_680 = vmulps_avx512vl(auVar120,auVar131);
      auVar131 = vfmadd213ps_avx512vl(auVar128,auVar116,auVar111);
      local_6a0 = vmulps_avx512vl(auVar120,auVar131);
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar131 = vblendmps_avx512vl(auVar131,auVar132);
      auVar134._0_4_ =
           (uint)(bVar83 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar83 & 1) * local_6a0._0_4_;
      bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar16 * auVar131._4_4_ | (uint)!bVar16 * local_6a0._4_4_;
      bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar16 * auVar131._8_4_ | (uint)!bVar16 * local_6a0._8_4_;
      bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar16 * auVar131._12_4_ | (uint)!bVar16 * local_6a0._12_4_;
      bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar16 * auVar131._16_4_ | (uint)!bVar16 * local_6a0._16_4_;
      bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar16 * auVar131._20_4_ | (uint)!bVar16 * local_6a0._20_4_;
      bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar16 * auVar131._24_4_ | (uint)!bVar16 * local_6a0._24_4_;
      bVar16 = SUB81(uVar95 >> 7,0);
      auVar134._28_4_ = (uint)bVar16 * auVar131._28_4_ | (uint)!bVar16 * local_6a0._28_4_;
      auVar233._8_4_ = 0xff800000;
      auVar233._0_8_ = 0xff800000ff800000;
      auVar233._12_4_ = 0xff800000;
      auVar233._16_4_ = 0xff800000;
      auVar233._20_4_ = 0xff800000;
      auVar233._24_4_ = 0xff800000;
      auVar233._28_4_ = 0xff800000;
      auVar131 = vblendmps_avx512vl(auVar233,auVar116);
      auVar135._0_4_ =
           (uint)(bVar83 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar116._0_4_;
      bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar16 * auVar131._4_4_ | (uint)!bVar16 * auVar116._4_4_;
      bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar16 * auVar131._8_4_ | (uint)!bVar16 * auVar116._8_4_;
      bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar16 * auVar131._12_4_ | (uint)!bVar16 * auVar116._12_4_;
      bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
      auVar135._16_4_ = (uint)bVar16 * auVar131._16_4_ | (uint)!bVar16 * auVar116._16_4_;
      bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
      auVar135._20_4_ = (uint)bVar16 * auVar131._20_4_ | (uint)!bVar16 * auVar116._20_4_;
      bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
      auVar135._24_4_ = (uint)bVar16 * auVar131._24_4_ | (uint)!bVar16 * auVar116._24_4_;
      bVar16 = SUB81(uVar95 >> 7,0);
      auVar135._28_4_ = (uint)bVar16 * auVar131._28_4_ | (uint)!bVar16 * auVar116._28_4_;
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_960,auVar116);
      auVar131 = vmaxps_avx512vl(local_5e0,auVar116);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      auVar131 = vmulps_avx512vl(auVar131,auVar32);
      vandps_avx512vl(auVar108,auVar116);
      uVar92 = vcmpps_avx512vl(auVar131,auVar131,1);
      uVar95 = uVar95 & uVar92;
      bVar90 = (byte)uVar95;
      if (bVar90 != 0) {
        uVar92 = vcmpps_avx512vl(auVar129,_DAT_02020f00,2);
        auVar250._8_4_ = 0xff800000;
        auVar250._0_8_ = 0xff800000ff800000;
        auVar250._12_4_ = 0xff800000;
        auVar250._16_4_ = 0xff800000;
        auVar250._20_4_ = 0xff800000;
        auVar250._24_4_ = 0xff800000;
        auVar250._28_4_ = 0xff800000;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar129 = vblendmps_avx512vl(auVar116,auVar250);
        bVar87 = (byte)uVar92;
        uVar96 = (uint)(bVar87 & 1) * auVar129._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar131._0_4_;
        bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
        uVar153 = (uint)bVar16 * auVar129._4_4_ | (uint)!bVar16 * auVar131._4_4_;
        bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
        uVar154 = (uint)bVar16 * auVar129._8_4_ | (uint)!bVar16 * auVar131._8_4_;
        bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
        uVar155 = (uint)bVar16 * auVar129._12_4_ | (uint)!bVar16 * auVar131._12_4_;
        bVar16 = (bool)((byte)(uVar92 >> 4) & 1);
        uVar156 = (uint)bVar16 * auVar129._16_4_ | (uint)!bVar16 * auVar131._16_4_;
        bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
        uVar157 = (uint)bVar16 * auVar129._20_4_ | (uint)!bVar16 * auVar131._20_4_;
        bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
        uVar158 = (uint)bVar16 * auVar129._24_4_ | (uint)!bVar16 * auVar131._24_4_;
        bVar16 = SUB81(uVar92 >> 7,0);
        uVar159 = (uint)bVar16 * auVar129._28_4_ | (uint)!bVar16 * auVar131._28_4_;
        auVar134._0_4_ = (bVar90 & 1) * uVar96 | !(bool)(bVar90 & 1) * auVar134._0_4_;
        bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar134._4_4_ = bVar16 * uVar153 | !bVar16 * auVar134._4_4_;
        bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar134._8_4_ = bVar16 * uVar154 | !bVar16 * auVar134._8_4_;
        bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar134._12_4_ = bVar16 * uVar155 | !bVar16 * auVar134._12_4_;
        bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar134._16_4_ = bVar16 * uVar156 | !bVar16 * auVar134._16_4_;
        bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar134._20_4_ = bVar16 * uVar157 | !bVar16 * auVar134._20_4_;
        bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar134._24_4_ = bVar16 * uVar158 | !bVar16 * auVar134._24_4_;
        bVar16 = SUB81(uVar95 >> 7,0);
        auVar134._28_4_ = bVar16 * uVar159 | !bVar16 * auVar134._28_4_;
        auVar116 = vblendmps_avx512vl(auVar250,auVar116);
        bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
        bVar20 = (bool)((byte)(uVar92 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar92 >> 6) & 1);
        bVar22 = SUB81(uVar92 >> 7,0);
        auVar135._0_4_ =
             (uint)(bVar90 & 1) *
             ((uint)(bVar87 & 1) * auVar116._0_4_ | !(bool)(bVar87 & 1) * uVar96) |
             !(bool)(bVar90 & 1) * auVar135._0_4_;
        bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
        auVar135._4_4_ =
             (uint)bVar94 * ((uint)bVar16 * auVar116._4_4_ | !bVar16 * uVar153) |
             !bVar94 * auVar135._4_4_;
        bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
        auVar135._8_4_ =
             (uint)bVar16 * ((uint)bVar17 * auVar116._8_4_ | !bVar17 * uVar154) |
             !bVar16 * auVar135._8_4_;
        bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
        auVar135._12_4_ =
             (uint)bVar16 * ((uint)bVar18 * auVar116._12_4_ | !bVar18 * uVar155) |
             !bVar16 * auVar135._12_4_;
        bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
        auVar135._16_4_ =
             (uint)bVar16 * ((uint)bVar19 * auVar116._16_4_ | !bVar19 * uVar156) |
             !bVar16 * auVar135._16_4_;
        bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
        auVar135._20_4_ =
             (uint)bVar16 * ((uint)bVar20 * auVar116._20_4_ | !bVar20 * uVar157) |
             !bVar16 * auVar135._20_4_;
        bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
        auVar135._24_4_ =
             (uint)bVar16 * ((uint)bVar21 * auVar116._24_4_ | !bVar21 * uVar158) |
             !bVar16 * auVar135._24_4_;
        bVar16 = SUB81(uVar95 >> 7,0);
        auVar135._28_4_ =
             (uint)bVar16 * ((uint)bVar22 * auVar116._28_4_ | !bVar22 * uVar159) |
             !bVar16 * auVar135._28_4_;
        bVar83 = (~bVar90 | bVar87) & bVar83;
      }
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    }
    auVar278 = ZEXT3264(auVar116);
    if ((bVar83 & 0x7f) == 0) {
      auVar280 = ZEXT3264(local_8e0);
      auVar279 = ZEXT3264(local_900);
    }
    else {
      fVar160 = *(float *)(ray + k * 4 + 0x100) - (float)local_7a0._0_4_;
      auVar234._4_4_ = fVar160;
      auVar234._0_4_ = fVar160;
      auVar234._8_4_ = fVar160;
      auVar234._12_4_ = fVar160;
      auVar234._16_4_ = fVar160;
      auVar234._20_4_ = fVar160;
      auVar234._24_4_ = fVar160;
      auVar234._28_4_ = fVar160;
      auVar129 = vminps_avx512vl(auVar234,auVar135);
      auVar78._4_4_ = fStack_3fc;
      auVar78._0_4_ = local_400;
      auVar78._8_4_ = fStack_3f8;
      auVar78._12_4_ = fStack_3f4;
      auVar78._16_4_ = fStack_3f0;
      auVar78._20_4_ = fStack_3ec;
      auVar78._24_4_ = fStack_3e8;
      auVar78._28_4_ = fStack_3e4;
      auVar131 = vmaxps_avx512vl(auVar78,auVar134);
      auVar125 = vmulps_avx512vl(auVar276,auVar125);
      auVar124 = vfmadd213ps_avx512vl(auVar124,auVar274,auVar125);
      auVar123 = vfmadd213ps_avx512vl(auVar123,auVar51,auVar124);
      auVar279 = ZEXT3264(local_900);
      auVar124 = vmulps_avx512vl(local_900,auVar276);
      auVar280 = ZEXT3264(local_8e0);
      auVar124 = vfmadd231ps_avx512vl(auVar124,local_8e0,auVar274);
      auVar124 = vfmadd231ps_avx512vl(auVar124,local_5c0,auVar51);
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar124,auVar125);
      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar24 = vcmpps_avx512vl(auVar125,auVar132,1);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar123 = vxorps_avx512vl(auVar123,auVar133);
      auVar136 = vrcp14ps_avx512vl(auVar124);
      auVar137 = vxorps_avx512vl(auVar124,auVar133);
      auVar138 = vfnmadd213ps_avx512vl(auVar136,auVar124,auVar116);
      auVar138 = vfmadd132ps_avx512vl(auVar138,auVar136,auVar136);
      auVar138 = vmulps_avx512vl(auVar138,auVar123);
      uVar26 = vcmpps_avx512vl(auVar124,auVar137,1);
      bVar90 = (byte)uVar24 | (byte)uVar26;
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar138,auVar139);
      auVar140._0_4_ =
           (uint)(bVar90 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar136._0_4_;
      bVar16 = (bool)(bVar90 >> 1 & 1);
      auVar140._4_4_ = (uint)bVar16 * auVar123._4_4_ | (uint)!bVar16 * auVar136._4_4_;
      bVar16 = (bool)(bVar90 >> 2 & 1);
      auVar140._8_4_ = (uint)bVar16 * auVar123._8_4_ | (uint)!bVar16 * auVar136._8_4_;
      bVar16 = (bool)(bVar90 >> 3 & 1);
      auVar140._12_4_ = (uint)bVar16 * auVar123._12_4_ | (uint)!bVar16 * auVar136._12_4_;
      bVar16 = (bool)(bVar90 >> 4 & 1);
      auVar140._16_4_ = (uint)bVar16 * auVar123._16_4_ | (uint)!bVar16 * auVar136._16_4_;
      bVar16 = (bool)(bVar90 >> 5 & 1);
      auVar140._20_4_ = (uint)bVar16 * auVar123._20_4_ | (uint)!bVar16 * auVar136._20_4_;
      bVar16 = (bool)(bVar90 >> 6 & 1);
      auVar140._24_4_ = (uint)bVar16 * auVar123._24_4_ | (uint)!bVar16 * auVar136._24_4_;
      auVar140._28_4_ =
           (uint)(bVar90 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar136._28_4_;
      auVar123 = vmaxps_avx(auVar131,auVar140);
      uVar26 = vcmpps_avx512vl(auVar124,auVar137,6);
      bVar90 = (byte)uVar24 | (byte)uVar26;
      auVar277 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar141._0_4_ = (uint)(bVar90 & 1) * 0x7f800000 | (uint)!(bool)(bVar90 & 1) * auVar138._0_4_;
      bVar16 = (bool)(bVar90 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._4_4_;
      bVar16 = (bool)(bVar90 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._8_4_;
      bVar16 = (bool)(bVar90 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._12_4_;
      bVar16 = (bool)(bVar90 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._16_4_;
      bVar16 = (bool)(bVar90 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._20_4_;
      bVar16 = (bool)(bVar90 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * auVar138._24_4_;
      auVar141._28_4_ =
           (uint)(bVar90 >> 7) * 0x7f800000 | (uint)!(bool)(bVar90 >> 7) * auVar138._28_4_;
      auVar124 = vminps_avx(auVar129,auVar141);
      auVar100 = vxorps_avx512vl(auVar137._0_16_,auVar137._0_16_);
      auVar117 = vsubps_avx512vl(ZEXT1632(auVar100),auVar117);
      auVar118 = vsubps_avx512vl(ZEXT1632(auVar100),auVar118);
      auVar129 = ZEXT1632(auVar100);
      auVar119 = vsubps_avx512vl(auVar129,auVar119);
      auVar56._4_4_ = auVar119._4_4_ * auVar122._4_4_;
      auVar56._0_4_ = auVar119._0_4_ * auVar122._0_4_;
      auVar56._8_4_ = auVar119._8_4_ * auVar122._8_4_;
      auVar56._12_4_ = auVar119._12_4_ * auVar122._12_4_;
      auVar56._16_4_ = auVar119._16_4_ * auVar122._16_4_;
      auVar56._20_4_ = auVar119._20_4_ * auVar122._20_4_;
      auVar56._24_4_ = auVar119._24_4_ * auVar122._24_4_;
      auVar56._28_4_ = auVar119._28_4_;
      auVar118 = vfnmsub231ps_avx512vl(auVar56,auVar121,auVar118);
      auVar117 = vfnmadd231ps_avx512vl(auVar118,auVar110,auVar117);
      auVar118 = vmulps_avx512vl(local_900,auVar122);
      auVar118 = vfnmsub231ps_avx512vl(auVar118,local_8e0,auVar121);
      auVar118 = vfnmadd231ps_avx512vl(auVar118,local_5c0,auVar110);
      vandps_avx512vl(auVar118,auVar125);
      uVar24 = vcmpps_avx512vl(auVar118,auVar132,1);
      auVar117 = vxorps_avx512vl(auVar117,auVar133);
      auVar119 = vrcp14ps_avx512vl(auVar118);
      auVar110 = vxorps_avx512vl(auVar118,auVar133);
      auVar122 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar116);
      auVar100 = vfmadd132ps_fma(auVar122,auVar119,auVar119);
      auVar275 = ZEXT1664(auVar100);
      fVar160 = auVar100._0_4_ * auVar117._0_4_;
      fVar258 = auVar100._4_4_ * auVar117._4_4_;
      auVar57._4_4_ = fVar258;
      auVar57._0_4_ = fVar160;
      fVar259 = auVar100._8_4_ * auVar117._8_4_;
      auVar57._8_4_ = fVar259;
      fVar260 = auVar100._12_4_ * auVar117._12_4_;
      auVar57._12_4_ = fVar260;
      fVar265 = auVar117._16_4_ * 0.0;
      auVar57._16_4_ = fVar265;
      fVar266 = auVar117._20_4_ * 0.0;
      auVar57._20_4_ = fVar266;
      fVar267 = auVar117._24_4_ * 0.0;
      auVar57._24_4_ = fVar267;
      auVar57._28_4_ = auVar117._28_4_;
      uVar26 = vcmpps_avx512vl(auVar118,auVar110,1);
      bVar90 = (byte)uVar24 | (byte)uVar26;
      auVar122 = vblendmps_avx512vl(auVar57,auVar139);
      auVar142._0_4_ =
           (uint)(bVar90 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar119._0_4_;
      bVar16 = (bool)(bVar90 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar16 * auVar122._4_4_ | (uint)!bVar16 * auVar119._4_4_;
      bVar16 = (bool)(bVar90 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar16 * auVar122._8_4_ | (uint)!bVar16 * auVar119._8_4_;
      bVar16 = (bool)(bVar90 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar16 * auVar122._12_4_ | (uint)!bVar16 * auVar119._12_4_;
      bVar16 = (bool)(bVar90 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar16 * auVar122._16_4_ | (uint)!bVar16 * auVar119._16_4_;
      bVar16 = (bool)(bVar90 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar16 * auVar122._20_4_ | (uint)!bVar16 * auVar119._20_4_;
      bVar16 = (bool)(bVar90 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar16 * auVar122._24_4_ | (uint)!bVar16 * auVar119._24_4_;
      auVar142._28_4_ =
           (uint)(bVar90 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar90 >> 7) * auVar119._28_4_;
      auVar269 = ZEXT3264(auVar142);
      _local_720 = vmaxps_avx(auVar123,auVar142);
      uVar26 = vcmpps_avx512vl(auVar118,auVar110,6);
      bVar90 = (byte)uVar24 | (byte)uVar26;
      auVar143._0_4_ = (uint)(bVar90 & 1) * 0x7f800000 | (uint)!(bool)(bVar90 & 1) * (int)fVar160;
      bVar16 = (bool)(bVar90 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar258;
      bVar16 = (bool)(bVar90 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar259;
      bVar16 = (bool)(bVar90 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar260;
      bVar16 = (bool)(bVar90 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar265;
      bVar16 = (bool)(bVar90 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar266;
      bVar16 = (bool)(bVar90 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar16 * 0x7f800000 | (uint)!bVar16 * (int)fVar267;
      auVar143._28_4_ =
           (uint)(bVar90 >> 7) * 0x7f800000 | (uint)!(bool)(bVar90 >> 7) * auVar117._28_4_;
      auVar264 = ZEXT3264(auVar143);
      local_460 = vminps_avx(auVar124,auVar143);
      auVar263 = ZEXT3264(local_460);
      uVar24 = vcmpps_avx512vl(_local_720,local_460,2);
      bVar83 = bVar83 & 0x7f & (byte)uVar24;
      if (bVar83 != 0) {
        auVar117 = vmaxps_avx512vl(auVar129,auVar112);
        auVar112 = vminps_avx512vl(local_680,auVar116);
        auVar63 = ZEXT412(0);
        auVar269 = ZEXT1264(auVar63) << 0x20;
        auVar112 = vmaxps_avx(auVar112,ZEXT1232(auVar63) << 0x20);
        auVar118 = vminps_avx512vl(local_6a0,auVar116);
        auVar275 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar58._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
        auVar58._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
        auVar58._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
        auVar58._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
        auVar58._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
        auVar58._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
        auVar58._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
        auVar58._28_4_ = auVar112._28_4_ + 7.0;
        auVar277 = ZEXT3264(local_8a0);
        auVar100 = vfmadd213ps_fma(auVar58,local_8a0,auVar246);
        local_680 = ZEXT1632(auVar100);
        auVar112 = vmaxps_avx(auVar118,ZEXT1232(auVar63) << 0x20);
        auVar59._4_4_ = (auVar112._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar112._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar112._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar112._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar112._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar112._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar112._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar112._28_4_ + 7.0;
        auVar100 = vfmadd213ps_fma(auVar59,local_8a0,auVar246);
        local_6a0 = ZEXT1632(auVar100);
        auVar235._0_4_ = auVar117._0_4_ * auVar117._0_4_;
        auVar235._4_4_ = auVar117._4_4_ * auVar117._4_4_;
        auVar235._8_4_ = auVar117._8_4_ * auVar117._8_4_;
        auVar235._12_4_ = auVar117._12_4_ * auVar117._12_4_;
        auVar235._16_4_ = auVar117._16_4_ * auVar117._16_4_;
        auVar235._20_4_ = auVar117._20_4_ * auVar117._20_4_;
        auVar235._24_4_ = auVar117._24_4_ * auVar117._24_4_;
        auVar235._28_4_ = 0;
        auVar112 = vsubps_avx(auVar127,auVar235);
        auVar113 = vmulps_avx512vl(auVar113,auVar112);
        auVar113 = vsubps_avx512vl(auVar130,auVar113);
        uVar24 = vcmpps_avx512vl(auVar113,ZEXT1232(auVar63) << 0x20,5);
        bVar90 = (byte)uVar24;
        if (bVar90 == 0) {
          auVar111 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar114 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar113 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar264 = ZEXT864(0) << 0x20;
          auVar144._8_4_ = 0x7f800000;
          auVar144._0_8_ = 0x7f8000007f800000;
          auVar144._12_4_ = 0x7f800000;
          auVar144._16_4_ = 0x7f800000;
          auVar144._20_4_ = 0x7f800000;
          auVar144._24_4_ = 0x7f800000;
          auVar144._28_4_ = 0x7f800000;
          auVar145._8_4_ = 0xff800000;
          auVar145._0_8_ = 0xff800000ff800000;
          auVar145._12_4_ = 0xff800000;
          auVar145._16_4_ = 0xff800000;
          auVar145._20_4_ = 0xff800000;
          auVar145._24_4_ = 0xff800000;
          auVar145._28_4_ = 0xff800000;
        }
        else {
          auVar101 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
          uVar95 = vcmpps_avx512vl(auVar113,auVar129,5);
          auVar113 = vsqrtps_avx(auVar113);
          auVar249._0_4_ = auVar108._0_4_ + auVar108._0_4_;
          auVar249._4_4_ = auVar108._4_4_ + auVar108._4_4_;
          auVar249._8_4_ = auVar108._8_4_ + auVar108._8_4_;
          auVar249._12_4_ = auVar108._12_4_ + auVar108._12_4_;
          auVar249._16_4_ = auVar108._16_4_ + auVar108._16_4_;
          auVar249._20_4_ = auVar108._20_4_ + auVar108._20_4_;
          auVar249._24_4_ = auVar108._24_4_ + auVar108._24_4_;
          auVar249._28_4_ = auVar108._28_4_ + auVar108._28_4_;
          auVar117 = vrcp14ps_avx512vl(auVar249);
          auVar116 = vfnmadd213ps_avx512vl(auVar249,auVar117,auVar116);
          auVar100 = vfmadd132ps_fma(auVar116,auVar117,auVar117);
          auVar33._8_4_ = 0x80000000;
          auVar33._0_8_ = 0x8000000080000000;
          auVar33._12_4_ = 0x80000000;
          auVar33._16_4_ = 0x80000000;
          auVar33._20_4_ = 0x80000000;
          auVar33._24_4_ = 0x80000000;
          auVar33._28_4_ = 0x80000000;
          auVar116 = vxorps_avx512vl(auVar126,auVar33);
          auVar116 = vsubps_avx(auVar116,auVar113);
          auVar60._4_4_ = auVar116._4_4_ * auVar100._4_4_;
          auVar60._0_4_ = auVar116._0_4_ * auVar100._0_4_;
          auVar60._8_4_ = auVar116._8_4_ * auVar100._8_4_;
          auVar60._12_4_ = auVar116._12_4_ * auVar100._12_4_;
          auVar60._16_4_ = auVar116._16_4_ * 0.0;
          auVar60._20_4_ = auVar116._20_4_ * 0.0;
          auVar60._24_4_ = auVar116._24_4_ * 0.0;
          auVar60._28_4_ = 0x3e000000;
          auVar113 = vsubps_avx512vl(auVar113,auVar126);
          auVar61._4_4_ = auVar113._4_4_ * auVar100._4_4_;
          auVar61._0_4_ = auVar113._0_4_ * auVar100._0_4_;
          auVar61._8_4_ = auVar113._8_4_ * auVar100._8_4_;
          auVar61._12_4_ = auVar113._12_4_ * auVar100._12_4_;
          auVar61._16_4_ = auVar113._16_4_ * 0.0;
          auVar61._20_4_ = auVar113._20_4_ * 0.0;
          auVar61._24_4_ = auVar113._24_4_ * 0.0;
          auVar61._28_4_ = fVar207;
          auVar277 = ZEXT3264(auVar61);
          auVar113 = vfmadd213ps_avx512vl(auVar128,auVar60,auVar111);
          auVar62._4_4_ = auVar120._4_4_ * auVar113._4_4_;
          auVar62._0_4_ = auVar120._0_4_ * auVar113._0_4_;
          auVar62._8_4_ = auVar120._8_4_ * auVar113._8_4_;
          auVar62._12_4_ = auVar120._12_4_ * auVar113._12_4_;
          auVar62._16_4_ = auVar120._16_4_ * auVar113._16_4_;
          auVar62._20_4_ = auVar120._20_4_ * auVar113._20_4_;
          auVar62._24_4_ = auVar120._24_4_ * auVar113._24_4_;
          auVar62._28_4_ = auVar116._28_4_;
          auVar116 = vmulps_avx512vl(local_5c0,auVar60);
          auVar113 = vmulps_avx512vl(local_8e0,auVar60);
          auVar117 = vmulps_avx512vl(local_900,auVar60);
          auVar118 = vfmadd213ps_avx512vl(auVar114,auVar62,auVar218);
          auVar116 = vsubps_avx512vl(auVar116,auVar118);
          auVar118 = vfmadd213ps_avx512vl(auVar115,auVar62,auVar201);
          auVar113 = vsubps_avx512vl(auVar113,auVar118);
          auVar100 = vfmadd213ps_fma(auVar62,auVar109,local_8c0);
          auVar117 = vsubps_avx(auVar117,ZEXT1632(auVar100));
          auVar264 = ZEXT3264(auVar117);
          auVar111 = vfmadd213ps_avx512vl(auVar128,auVar61,auVar111);
          auVar117 = vmulps_avx512vl(auVar120,auVar111);
          auVar111 = vmulps_avx512vl(local_5c0,auVar61);
          auVar118 = vmulps_avx512vl(local_8e0,auVar61);
          auVar119 = vmulps_avx512vl(local_900,auVar61);
          auVar100 = vfmadd213ps_fma(auVar114,auVar117,auVar218);
          auVar111 = vsubps_avx(auVar111,ZEXT1632(auVar100));
          auVar269 = ZEXT3264(auVar111);
          auVar100 = vfmadd213ps_fma(auVar115,auVar117,auVar201);
          auVar111 = vsubps_avx512vl(auVar118,ZEXT1632(auVar100));
          auVar100 = vfmadd213ps_fma(auVar109,auVar117,local_8c0);
          auVar114 = vsubps_avx512vl(auVar119,ZEXT1632(auVar100));
          auVar171._8_4_ = 0x7f800000;
          auVar171._0_8_ = 0x7f8000007f800000;
          auVar171._12_4_ = 0x7f800000;
          auVar171._16_4_ = 0x7f800000;
          auVar171._20_4_ = 0x7f800000;
          auVar171._24_4_ = 0x7f800000;
          auVar171._28_4_ = 0x7f800000;
          auVar115 = vblendmps_avx512vl(auVar171,auVar60);
          bVar16 = (bool)((byte)uVar95 & 1);
          auVar144._0_4_ = (uint)bVar16 * auVar115._0_4_ | (uint)!bVar16 * auVar107._0_4_;
          bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
          auVar144._4_4_ = (uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * auVar107._4_4_;
          bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
          auVar144._8_4_ = (uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * auVar107._8_4_;
          bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
          auVar144._12_4_ = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * auVar107._12_4_;
          iVar1 = (uint)((byte)(uVar95 >> 4) & 1) * auVar115._16_4_;
          auVar144._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar95 >> 5) & 1) * auVar115._20_4_;
          auVar144._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar95 >> 6) & 1) * auVar115._24_4_;
          auVar144._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar95 >> 7) * auVar115._28_4_;
          auVar144._28_4_ = iVar4;
          auVar172._8_4_ = 0xff800000;
          auVar172._0_8_ = 0xff800000ff800000;
          auVar172._12_4_ = 0xff800000;
          auVar172._16_4_ = 0xff800000;
          auVar172._20_4_ = 0xff800000;
          auVar172._24_4_ = 0xff800000;
          auVar172._28_4_ = 0xff800000;
          auVar115 = vblendmps_avx512vl(auVar172,auVar61);
          bVar16 = (bool)((byte)uVar95 & 1);
          auVar145._0_4_ = (uint)bVar16 * auVar115._0_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
          auVar145._4_4_ = (uint)bVar16 * auVar115._4_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
          auVar145._8_4_ = (uint)bVar16 * auVar115._8_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
          auVar145._12_4_ = (uint)bVar16 * auVar115._12_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
          auVar145._16_4_ = (uint)bVar16 * auVar115._16_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
          auVar145._20_4_ = (uint)bVar16 * auVar115._20_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
          auVar145._24_4_ = (uint)bVar16 * auVar115._24_4_ | (uint)!bVar16 * -0x800000;
          bVar16 = SUB81(uVar95 >> 7,0);
          auVar145._28_4_ = (uint)bVar16 * auVar115._28_4_ | (uint)!bVar16 * -0x800000;
          auVar261._8_4_ = 0x7fffffff;
          auVar261._0_8_ = 0x7fffffff7fffffff;
          auVar261._12_4_ = 0x7fffffff;
          auVar261._16_4_ = 0x7fffffff;
          auVar261._20_4_ = 0x7fffffff;
          auVar261._24_4_ = 0x7fffffff;
          auVar261._28_4_ = 0x7fffffff;
          auVar115 = vandps_avx(auVar261,local_960);
          auVar275 = ZEXT3264(local_5e0);
          auVar115 = vmaxps_avx(local_5e0,auVar115);
          auVar34._8_4_ = 0x36000000;
          auVar34._0_8_ = 0x3600000036000000;
          auVar34._12_4_ = 0x36000000;
          auVar34._16_4_ = 0x36000000;
          auVar34._20_4_ = 0x36000000;
          auVar34._24_4_ = 0x36000000;
          auVar34._28_4_ = 0x36000000;
          auVar117 = vmulps_avx512vl(auVar115,auVar34);
          auVar115 = vandps_avx(auVar108,auVar261);
          uVar92 = vcmpps_avx512vl(auVar115,auVar117,1);
          uVar95 = uVar95 & uVar92;
          bVar87 = (byte)uVar95;
          if (bVar87 != 0) {
            uVar92 = vcmpps_avx512vl(auVar112,ZEXT1632(auVar101),2);
            auVar262._8_4_ = 0xff800000;
            auVar262._0_8_ = 0xff800000ff800000;
            auVar262._12_4_ = 0xff800000;
            auVar262._16_4_ = 0xff800000;
            auVar262._20_4_ = 0xff800000;
            auVar262._24_4_ = 0xff800000;
            auVar262._28_4_ = 0xff800000;
            auVar270._8_4_ = 0x7f800000;
            auVar270._0_8_ = 0x7f8000007f800000;
            auVar270._12_4_ = 0x7f800000;
            auVar270._16_4_ = 0x7f800000;
            auVar270._20_4_ = 0x7f800000;
            auVar270._24_4_ = 0x7f800000;
            auVar270._28_4_ = 0x7f800000;
            auVar112 = vblendmps_avx512vl(auVar270,auVar262);
            bVar89 = (byte)uVar92;
            uVar96 = (uint)(bVar89 & 1) * auVar112._0_4_ |
                     (uint)!(bool)(bVar89 & 1) * auVar117._0_4_;
            bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
            uVar153 = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * auVar117._4_4_;
            bVar16 = (bool)((byte)(uVar92 >> 2) & 1);
            uVar154 = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * auVar117._8_4_;
            bVar16 = (bool)((byte)(uVar92 >> 3) & 1);
            uVar155 = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * auVar117._12_4_;
            bVar16 = (bool)((byte)(uVar92 >> 4) & 1);
            uVar156 = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * auVar117._16_4_;
            bVar16 = (bool)((byte)(uVar92 >> 5) & 1);
            uVar157 = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * auVar117._20_4_;
            bVar16 = (bool)((byte)(uVar92 >> 6) & 1);
            uVar158 = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * auVar117._24_4_;
            bVar16 = SUB81(uVar92 >> 7,0);
            uVar159 = (uint)bVar16 * auVar112._28_4_ | (uint)!bVar16 * auVar117._28_4_;
            auVar144._0_4_ = (bVar87 & 1) * uVar96 | !(bool)(bVar87 & 1) * auVar144._0_4_;
            bVar16 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar144._4_4_ = bVar16 * uVar153 | !bVar16 * auVar144._4_4_;
            bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar144._8_4_ = bVar16 * uVar154 | !bVar16 * auVar144._8_4_;
            bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar144._12_4_ = bVar16 * uVar155 | !bVar16 * auVar144._12_4_;
            bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar144._16_4_ = bVar16 * uVar156 | (uint)!bVar16 * iVar1;
            bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar144._20_4_ = bVar16 * uVar157 | (uint)!bVar16 * iVar2;
            bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar144._24_4_ = bVar16 * uVar158 | (uint)!bVar16 * iVar3;
            bVar16 = SUB81(uVar95 >> 7,0);
            auVar144._28_4_ = bVar16 * uVar159 | (uint)!bVar16 * iVar4;
            auVar112 = vblendmps_avx512vl(auVar262,auVar270);
            bVar16 = (bool)((byte)(uVar92 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar92 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar92 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar92 >> 4) & 1);
            bVar20 = (bool)((byte)(uVar92 >> 5) & 1);
            bVar21 = (bool)((byte)(uVar92 >> 6) & 1);
            bVar22 = SUB81(uVar92 >> 7,0);
            auVar145._0_4_ =
                 (uint)(bVar87 & 1) *
                 ((uint)(bVar89 & 1) * auVar112._0_4_ | !(bool)(bVar89 & 1) * uVar96) |
                 !(bool)(bVar87 & 1) * auVar145._0_4_;
            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
            auVar145._4_4_ =
                 (uint)bVar94 * ((uint)bVar16 * auVar112._4_4_ | !bVar16 * uVar153) |
                 !bVar94 * auVar145._4_4_;
            bVar16 = (bool)((byte)(uVar95 >> 2) & 1);
            auVar145._8_4_ =
                 (uint)bVar16 * ((uint)bVar17 * auVar112._8_4_ | !bVar17 * uVar154) |
                 !bVar16 * auVar145._8_4_;
            bVar16 = (bool)((byte)(uVar95 >> 3) & 1);
            auVar145._12_4_ =
                 (uint)bVar16 * ((uint)bVar18 * auVar112._12_4_ | !bVar18 * uVar155) |
                 !bVar16 * auVar145._12_4_;
            bVar16 = (bool)((byte)(uVar95 >> 4) & 1);
            auVar145._16_4_ =
                 (uint)bVar16 * ((uint)bVar19 * auVar112._16_4_ | !bVar19 * uVar156) |
                 !bVar16 * auVar145._16_4_;
            bVar16 = (bool)((byte)(uVar95 >> 5) & 1);
            auVar145._20_4_ =
                 (uint)bVar16 * ((uint)bVar20 * auVar112._20_4_ | !bVar20 * uVar157) |
                 !bVar16 * auVar145._20_4_;
            bVar16 = (bool)((byte)(uVar95 >> 6) & 1);
            auVar145._24_4_ =
                 (uint)bVar16 * ((uint)bVar21 * auVar112._24_4_ | !bVar21 * uVar158) |
                 !bVar16 * auVar145._24_4_;
            bVar16 = SUB81(uVar95 >> 7,0);
            auVar145._28_4_ =
                 (uint)bVar16 * ((uint)bVar22 * auVar112._28_4_ | !bVar22 * uVar159) |
                 !bVar16 * auVar145._28_4_;
            bVar90 = (~bVar87 | bVar89) & bVar90;
          }
        }
        auVar112 = vmulps_avx512vl(local_900,auVar114);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_8e0,auVar111);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_5c0,auVar269._0_32_);
        _local_1c0 = _local_720;
        local_1a0 = vminps_avx(local_460,auVar144);
        auVar257._8_4_ = 0x7fffffff;
        auVar257._0_8_ = 0x7fffffff7fffffff;
        auVar257._12_4_ = 0x7fffffff;
        auVar257._16_4_ = 0x7fffffff;
        auVar257._20_4_ = 0x7fffffff;
        auVar257._24_4_ = 0x7fffffff;
        auVar257._28_4_ = 0x7fffffff;
        auVar112 = vandps_avx(auVar112,auVar257);
        _local_6e0 = vmaxps_avx(_local_720,auVar145);
        auVar254 = ZEXT3264(_local_6e0);
        _local_480 = _local_6e0;
        auVar173._8_4_ = 0x3e99999a;
        auVar173._0_8_ = 0x3e99999a3e99999a;
        auVar173._12_4_ = 0x3e99999a;
        auVar173._16_4_ = 0x3e99999a;
        auVar173._20_4_ = 0x3e99999a;
        auVar173._24_4_ = 0x3e99999a;
        auVar173._28_4_ = 0x3e99999a;
        uVar24 = vcmpps_avx512vl(auVar112,auVar173,1);
        uVar26 = vcmpps_avx512vl(_local_720,local_1a0,2);
        bVar87 = (byte)uVar26 & bVar83;
        uVar25 = vcmpps_avx512vl(_local_6e0,local_460,2);
        if ((bVar83 & ((byte)uVar25 | (byte)uVar26)) == 0) {
          auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar278 = ZEXT3264(auVar112);
        }
        else {
          auVar112 = vmulps_avx512vl(local_900,auVar264._0_32_);
          auVar112 = vfmadd213ps_avx512vl(auVar113,local_8e0,auVar112);
          auVar112 = vfmadd213ps_avx512vl(auVar116,local_5c0,auVar112);
          auVar112 = vandps_avx(auVar112,auVar257);
          uVar26 = vcmpps_avx512vl(auVar112,auVar173,1);
          bVar89 = (byte)uVar26 | ~bVar90;
          auVar174._8_4_ = 2;
          auVar174._0_8_ = 0x200000002;
          auVar174._12_4_ = 2;
          auVar174._16_4_ = 2;
          auVar174._20_4_ = 2;
          auVar174._24_4_ = 2;
          auVar174._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar112 = vpblendmd_avx512vl(auVar174,auVar35);
          local_440._0_4_ = (uint)(bVar89 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar89 & 1) * 2;
          bVar16 = (bool)(bVar89 >> 1 & 1);
          local_440._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar89 >> 2 & 1);
          local_440._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar89 >> 3 & 1);
          local_440._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar89 >> 4 & 1);
          local_440._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar89 >> 5 & 1);
          local_440._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar89 >> 6 & 1);
          local_440._24_4_ = (uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 2;
          local_440._28_4_ = (uint)(bVar89 >> 7) * auVar112._28_4_ | (uint)!(bool)(bVar89 >> 7) * 2;
          local_600 = vpbroadcastd_avx512vl();
          uVar26 = vpcmpd_avx512vl(local_600,local_440,5);
          bVar89 = (byte)uVar26 & bVar87;
          auVar240._8_4_ = 0x7fffffff;
          auVar240._0_8_ = 0x7fffffff7fffffff;
          auVar240._12_4_ = 0x7fffffff;
          if (bVar89 != 0) {
            auVar100 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar107 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar101 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar99 = vminps_avx(auVar100,auVar101);
            auVar100 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar101 = vmaxps_avx(auVar107,auVar100);
            auVar107 = vandps_avx(auVar99,auVar240);
            auVar100 = vandps_avx(auVar101,auVar240);
            auVar107 = vmaxps_avx(auVar107,auVar100);
            auVar100 = vmovshdup_avx(auVar107);
            auVar100 = vmaxss_avx(auVar100,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar100);
            fVar160 = auVar107._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar101,auVar101,0xff);
            local_6c0 = (float)local_720._0_4_ + (float)local_700._0_4_;
            fStack_6bc = (float)local_720._4_4_ + (float)local_700._4_4_;
            fStack_6b8 = fStack_718 + fStack_6f8;
            fStack_6b4 = fStack_714 + fStack_6f4;
            fStack_6b0 = fStack_710 + fStack_6f0;
            fStack_6ac = fStack_70c + fStack_6ec;
            fStack_6a8 = fStack_708 + fStack_6e8;
            fStack_6a4 = fStack_704 + fStack_6e4;
            do {
              auVar175._8_4_ = 0x7f800000;
              auVar175._0_8_ = 0x7f8000007f800000;
              auVar175._12_4_ = 0x7f800000;
              auVar175._16_4_ = 0x7f800000;
              auVar175._20_4_ = 0x7f800000;
              auVar175._24_4_ = 0x7f800000;
              auVar175._28_4_ = 0x7f800000;
              auVar112 = vblendmps_avx512vl(auVar175,_local_720);
              auVar146._0_4_ =
                   (uint)(bVar89 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar89 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar89 >> 1 & 1);
              auVar146._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar89 >> 2 & 1);
              auVar146._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar89 >> 3 & 1);
              auVar146._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar89 >> 4 & 1);
              auVar146._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar89 >> 5 & 1);
              auVar146._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
              auVar146._24_4_ =
                   (uint)(bVar89 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar89 >> 6) * 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar112 = vshufps_avx(auVar146,auVar146,0xb1);
              auVar112 = vminps_avx(auVar146,auVar112);
              auVar111 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar111);
              auVar111 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar111);
              uVar26 = vcmpps_avx512vl(auVar146,auVar112,0);
              bVar84 = (byte)uVar26 & bVar89;
              bVar85 = bVar89;
              if (bVar84 != 0) {
                bVar85 = bVar84;
              }
              iVar2 = 0;
              for (uVar96 = (uint)bVar85; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar96 = *(uint *)(local_680 + (uint)(iVar2 << 2));
              uVar153 = *(uint *)(local_1c0 + (uint)(iVar2 << 2));
              fVar258 = auVar23._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar258 = sqrtf((float)local_880._0_4_);
              }
              auVar269 = ZEXT464(uVar96);
              auVar263 = ZEXT464(uVar153);
              lVar93 = 4;
              do {
                fVar259 = auVar263._0_4_;
                auVar163._4_4_ = fVar259;
                auVar163._0_4_ = fVar259;
                auVar163._8_4_ = fVar259;
                auVar163._12_4_ = fVar259;
                auVar107 = vfmadd132ps_fma(auVar163,ZEXT816(0) << 0x40,local_870);
                fVar268 = auVar269._0_4_;
                fVar251 = 1.0 - fVar268;
                fVar266 = fVar251 * fVar251 * fVar251;
                fVar260 = fVar268 * fVar268;
                fVar226 = fVar268 * fVar260;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar266),
                                           ZEXT416((uint)fVar226));
                fVar265 = fVar268 * fVar251;
                auVar98 = ZEXT416((uint)fVar251);
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar268 * fVar265 * 6.0)),
                                          ZEXT416((uint)(fVar265 * fVar251)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                           ZEXT416((uint)fVar266));
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar251 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar268 * fVar265)));
                fVar266 = fVar266 * 0.16666667;
                fVar267 = (auVar100._0_4_ + auVar99._0_4_) * 0.16666667;
                fVar185 = (auVar101._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar226 = fVar226 * 0.16666667;
                auVar208._0_4_ = fVar226 * (float)local_860._0_4_;
                auVar208._4_4_ = fVar226 * (float)local_860._4_4_;
                auVar208._8_4_ = fVar226 * fStack_858;
                auVar208._12_4_ = fVar226 * fStack_854;
                auVar241._4_4_ = fVar185;
                auVar241._0_4_ = fVar185;
                auVar241._8_4_ = fVar185;
                auVar241._12_4_ = fVar185;
                auVar100 = vfmadd132ps_fma(auVar241,auVar208,local_820._0_16_);
                auVar209._4_4_ = fVar267;
                auVar209._0_4_ = fVar267;
                auVar209._8_4_ = fVar267;
                auVar209._12_4_ = fVar267;
                auVar100 = vfmadd132ps_fma(auVar209,auVar100,local_840._0_16_);
                auVar187._4_4_ = fVar266;
                auVar187._0_4_ = fVar266;
                auVar187._8_4_ = fVar266;
                auVar187._12_4_ = fVar266;
                local_740 = vfmadd132ps_fma(auVar187,auVar100,local_800._0_16_);
                auVar107 = vsubps_avx(auVar107,local_740);
                local_8a0._0_16_ = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar100 = auVar269._0_16_;
                local_8c0._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_960._0_4_ = fVar260;
                  auVar275._0_4_ = sqrtf(auVar107._0_4_);
                  auVar275._4_60_ = extraout_var;
                  auVar107 = auVar275._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  local_960._0_4_ = fVar260;
                }
                auVar99 = vfnmsub213ss_fma(auVar100,auVar100,ZEXT416((uint)(fVar265 * 4.0)));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * 4.0)),auVar98,auVar98);
                fVar260 = fVar251 * -fVar251 * 0.5;
                fVar265 = auVar99._0_4_ * 0.5;
                fVar266 = auVar101._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar229._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar229._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar229._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar229._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar188._4_4_ = fVar266;
                auVar188._0_4_ = fVar266;
                auVar188._8_4_ = fVar266;
                auVar188._12_4_ = fVar266;
                auVar101 = vfmadd132ps_fma(auVar188,auVar229,local_820._0_16_);
                auVar210._4_4_ = fVar265;
                auVar210._0_4_ = fVar265;
                auVar210._8_4_ = fVar265;
                auVar210._12_4_ = fVar265;
                auVar101 = vfmadd132ps_fma(auVar210,auVar101,local_840._0_16_);
                auVar272._4_4_ = fVar260;
                auVar272._0_4_ = fVar260;
                auVar272._8_4_ = fVar260;
                auVar272._12_4_ = fVar260;
                local_960._0_16_ = vfmadd132ps_fma(auVar272,auVar101,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar64._12_4_ = 0;
                auVar64._0_12_ = ZEXT812(0);
                fVar260 = local_760._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar260));
                fVar265 = auVar101._0_4_;
                local_770 = vrcp14ss_avx512f(auVar64 << 0x20,ZEXT416((uint)fVar260));
                auVar101 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar96 = auVar107._0_4_;
                local_750 = fVar251;
                fStack_74c = fVar251;
                fStack_748 = fVar251;
                fStack_744 = fVar251;
                if (fVar260 < -fVar260) {
                  fVar266 = sqrtf(fVar260);
                  auVar107 = ZEXT416(uVar96);
                  auVar99 = local_960._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(local_760,local_760);
                  fVar266 = auVar99._0_4_;
                  auVar99 = local_960._0_16_;
                }
                fVar260 = fVar265 * 1.5 + fVar260 * -0.5 * fVar265 * fVar265 * fVar265;
                auVar164._0_4_ = auVar99._0_4_ * fVar260;
                auVar164._4_4_ = auVar99._4_4_ * fVar260;
                auVar164._8_4_ = auVar99._8_4_ * fVar260;
                auVar164._12_4_ = auVar99._12_4_ * fVar260;
                auVar6 = vdpps_avx(local_8a0._0_16_,auVar164,0x7f);
                fVar185 = auVar107._0_4_;
                fVar265 = auVar6._0_4_;
                auVar165._0_4_ = fVar265 * fVar265;
                auVar165._4_4_ = auVar6._4_4_ * auVar6._4_4_;
                auVar165._8_4_ = auVar6._8_4_ * auVar6._8_4_;
                auVar165._12_4_ = auVar6._12_4_ * auVar6._12_4_;
                auVar102 = vsubps_avx512vl(local_8c0._0_16_,auVar165);
                fVar267 = auVar102._0_4_;
                auVar189._4_12_ = ZEXT812(0) << 0x20;
                auVar189._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                auVar104 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar105 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                if (fVar267 < 0.0) {
                  local_790 = fVar260;
                  fStack_78c = fVar260;
                  fStack_788 = fVar260;
                  fStack_784 = fVar260;
                  local_780 = auVar103;
                  fVar267 = sqrtf(fVar267);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar107 = ZEXT416(uVar96);
                  auVar99 = local_960._0_16_;
                  auVar103 = local_780;
                  fVar260 = local_790;
                  fVar226 = fStack_78c;
                  fVar251 = fStack_788;
                  fVar252 = fStack_784;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar267 = auVar102._0_4_;
                  fVar226 = fVar260;
                  fVar251 = fVar260;
                  fVar252 = fVar260;
                }
                auVar275 = ZEXT1664(auVar99);
                auVar264 = ZEXT1664(local_8a0._0_16_);
                auVar280 = ZEXT3264(local_8e0);
                auVar279 = ZEXT3264(local_900);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,auVar100);
                auVar100 = vfmadd231ss_fma(auVar98,auVar100,SUB6416(ZEXT464(0xc0000000),0));
                auVar211._0_4_ = fVar268 * (float)local_860._0_4_;
                auVar211._4_4_ = fVar268 * (float)local_860._4_4_;
                auVar211._8_4_ = fVar268 * fStack_858;
                auVar211._12_4_ = fVar268 * fStack_854;
                auVar230._0_4_ = auVar100._0_4_;
                auVar230._4_4_ = auVar230._0_4_;
                auVar230._8_4_ = auVar230._0_4_;
                auVar230._12_4_ = auVar230._0_4_;
                auVar100 = vfmadd132ps_fma(auVar230,auVar211,local_820._0_16_);
                auVar190._0_4_ = auVar102._0_4_;
                auVar190._4_4_ = auVar190._0_4_;
                auVar190._8_4_ = auVar190._0_4_;
                auVar190._12_4_ = auVar190._0_4_;
                auVar100 = vfmadd132ps_fma(auVar190,auVar100,local_840._0_16_);
                auVar74._4_4_ = fStack_74c;
                auVar74._0_4_ = local_750;
                auVar74._8_4_ = fStack_748;
                auVar74._12_4_ = fStack_744;
                auVar100 = vfmadd132ps_fma(auVar74,auVar100,local_800._0_16_);
                auVar191._0_4_ = auVar100._0_4_ * (float)local_760._0_4_;
                auVar191._4_4_ = auVar100._4_4_ * (float)local_760._0_4_;
                auVar191._8_4_ = auVar100._8_4_ * (float)local_760._0_4_;
                auVar191._12_4_ = auVar100._12_4_ * (float)local_760._0_4_;
                auVar100 = vdpps_avx(auVar99,auVar100,0x7f);
                fVar207 = auVar100._0_4_;
                auVar212._0_4_ = auVar99._0_4_ * fVar207;
                auVar212._4_4_ = auVar99._4_4_ * fVar207;
                auVar212._8_4_ = auVar99._8_4_ * fVar207;
                auVar212._12_4_ = auVar99._12_4_ * fVar207;
                auVar100 = vsubps_avx(auVar191,auVar212);
                fVar207 = auVar101._0_4_ * (float)local_770._0_4_;
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar148._16_16_ = local_900._16_16_;
                auVar106 = vxorps_avx512vl(auVar99,auVar27);
                auVar242._0_4_ = fVar260 * auVar100._0_4_ * fVar207;
                auVar242._4_4_ = fVar226 * auVar100._4_4_ * fVar207;
                auVar242._8_4_ = fVar251 * auVar100._8_4_ * fVar207;
                auVar242._12_4_ = fVar252 * auVar100._12_4_ * fVar207;
                auVar100 = vdpps_avx(auVar106,auVar164,0x7f);
                auVar98 = vmaxss_avx(ZEXT416((uint)fVar160),
                                     ZEXT416((uint)(fVar259 * fVar258 * 1.9073486e-06)));
                auVar101 = vdpps_avx(local_8a0._0_16_,auVar242,0x7f);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar160),auVar98);
                auVar102 = vfmadd213ss_fma(ZEXT416((uint)(fVar185 + 1.0)),
                                           ZEXT416((uint)(fVar160 / fVar266)),auVar107);
                auVar277 = ZEXT1664(auVar102);
                auVar107 = vdpps_avx(local_870,auVar164,0x7f);
                fVar260 = auVar100._0_4_ + auVar101._0_4_;
                auVar100 = vdpps_avx(local_8a0._0_16_,auVar106,0x7f);
                auVar105 = vmulss_avx512f(auVar105,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar101 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar105 = vaddss_avx512f(auVar104,ZEXT416((uint)(auVar105._0_4_ * auVar103._0_4_)))
                ;
                auVar103 = vfnmadd231ss_fma(auVar100,auVar6,ZEXT416((uint)fVar260));
                auVar104 = vfnmadd231ss_fma(auVar101,auVar6,auVar107);
                auVar100 = vpermilps_avx(local_740,0xff);
                fVar267 = fVar267 - auVar100._0_4_;
                auVar100 = vshufps_avx(auVar99,auVar99,0xff);
                auVar101 = vfmsub213ss_fma(auVar103,auVar105,auVar100);
                fVar266 = auVar104._0_4_ * auVar105._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar101._0_4_)),
                                           ZEXT416((uint)fVar260),ZEXT416((uint)fVar266));
                fVar226 = auVar103._0_4_;
                fVar185 = fVar265 * (auVar101._0_4_ / fVar226);
                auVar254 = ZEXT464((uint)fVar185);
                fVar268 = fVar268 - (fVar265 * (fVar266 / fVar226) -
                                    fVar267 * (auVar107._0_4_ / fVar226));
                auVar269 = ZEXT464((uint)fVar268);
                fVar259 = fVar259 - (fVar267 * (fVar260 / fVar226) - fVar185);
                auVar263 = ZEXT464((uint)fVar259);
                auVar240._8_4_ = 0x7fffffff;
                auVar240._0_8_ = 0x7fffffff7fffffff;
                auVar240._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar6,auVar240);
                if (auVar102._0_4_ <= auVar107._0_4_) {
LAB_01e9d6e6:
                  bVar16 = false;
                }
                else {
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar98._0_4_)),
                                             local_7b0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(ZEXT416((uint)fVar267),auVar240);
                  if (auVar101._0_4_ <= auVar107._0_4_) goto LAB_01e9d6e6;
                  fVar259 = fVar259 + (float)local_7a0._0_4_;
                  auVar263 = ZEXT464((uint)fVar259);
                  bVar16 = true;
                  if (fVar227 <= fVar259) {
                    fVar260 = *(float *)(ray + k * 4 + 0x100);
                    auVar254 = ZEXT464((uint)fVar260);
                    if (((fVar259 <= fVar260) && (0.0 <= fVar268)) && (fVar268 <= 1.0)) {
                      auVar148._0_16_ = ZEXT816(0) << 0x20;
                      auVar147._4_28_ = auVar148._4_28_;
                      auVar147._0_4_ = local_8c0._0_4_;
                      auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar147._0_16_);
                      fVar265 = auVar107._0_4_;
                      auVar107 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                      pGVar10 = (context->scene->geometries).items[uVar88].ptr;
                      if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01e9d992:
                        auVar254 = ZEXT464((uint)fVar260);
                      }
                      else {
                        fVar265 = fVar265 * 1.5 + auVar107._0_4_ * fVar265 * fVar265 * fVar265;
                        auVar192._0_4_ = local_8a0._0_4_ * fVar265;
                        auVar192._4_4_ = local_8a0._4_4_ * fVar265;
                        auVar192._8_4_ = local_8a0._8_4_ * fVar265;
                        auVar192._12_4_ = local_8a0._12_4_ * fVar265;
                        auVar6 = vfmadd213ps_fma(auVar100,auVar192,auVar99);
                        auVar107 = vshufps_avx(auVar192,auVar192,0xc9);
                        auVar100 = vshufps_avx(auVar99,auVar99,0xc9);
                        auVar193._0_4_ = auVar192._0_4_ * auVar100._0_4_;
                        auVar193._4_4_ = auVar192._4_4_ * auVar100._4_4_;
                        auVar193._8_4_ = auVar192._8_4_ * auVar100._8_4_;
                        auVar193._12_4_ = auVar192._12_4_ * auVar100._12_4_;
                        auVar101 = vfmsub231ps_fma(auVar193,auVar99,auVar107);
                        auVar107 = vshufps_avx(auVar101,auVar101,0xc9);
                        auVar100 = vshufps_avx(auVar6,auVar6,0xc9);
                        auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                        auVar166._0_4_ = auVar6._0_4_ * auVar101._0_4_;
                        auVar166._4_4_ = auVar6._4_4_ * auVar101._4_4_;
                        auVar166._8_4_ = auVar6._8_4_ * auVar101._8_4_;
                        auVar166._12_4_ = auVar6._12_4_ * auVar101._12_4_;
                        auVar107 = vfmsub231ps_fma(auVar166,auVar107,auVar100);
                        uVar162 = auVar107._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x100) = fVar259;
                          uVar9 = vextractps_avx(auVar107,1);
                          *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                          uVar9 = vextractps_avx(auVar107,2);
                          *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                          *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar162;
                          *(float *)(ray + k * 4 + 0x1e0) = fVar268;
                          *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                          *(uint *)(ray + k * 4 + 0x220) = uVar8;
                          *(uint *)(ray + k * 4 + 0x240) = uVar88;
                          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar14 = context->user;
                          auVar219._8_4_ = 1;
                          auVar219._0_8_ = 0x100000001;
                          auVar219._12_4_ = 1;
                          auVar219._16_4_ = 1;
                          auVar219._20_4_ = 1;
                          auVar219._24_4_ = 1;
                          auVar219._28_4_ = 1;
                          auVar112 = vpermps_avx2(auVar219,ZEXT1632(auVar107));
                          auVar236._8_4_ = 2;
                          auVar236._0_8_ = 0x200000002;
                          auVar236._12_4_ = 2;
                          auVar236._16_4_ = 2;
                          auVar236._20_4_ = 2;
                          auVar236._24_4_ = 2;
                          auVar236._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar236,ZEXT1632(auVar107));
                          local_5a0[0] = (RTCHitN)auVar112[0];
                          local_5a0[1] = (RTCHitN)auVar112[1];
                          local_5a0[2] = (RTCHitN)auVar112[2];
                          local_5a0[3] = (RTCHitN)auVar112[3];
                          local_5a0[4] = (RTCHitN)auVar112[4];
                          local_5a0[5] = (RTCHitN)auVar112[5];
                          local_5a0[6] = (RTCHitN)auVar112[6];
                          local_5a0[7] = (RTCHitN)auVar112[7];
                          local_5a0[8] = (RTCHitN)auVar112[8];
                          local_5a0[9] = (RTCHitN)auVar112[9];
                          local_5a0[10] = (RTCHitN)auVar112[10];
                          local_5a0[0xb] = (RTCHitN)auVar112[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar112[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar112[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar112[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar112[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar112[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar112[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar112[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar112[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar112[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar112[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar112[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar112[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar112[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar112[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar112[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar112[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar112[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar112[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar112[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar112[0x1f];
                          local_560 = uVar162;
                          uStack_55c = uVar162;
                          uStack_558 = uVar162;
                          uStack_554 = uVar162;
                          uStack_550 = uVar162;
                          uStack_54c = uVar162;
                          uStack_548 = uVar162;
                          uStack_544 = uVar162;
                          local_540 = fVar268;
                          fStack_53c = fVar268;
                          fStack_538 = fVar268;
                          fStack_534 = fVar268;
                          fStack_530 = fVar268;
                          fStack_52c = fVar268;
                          fStack_528 = fVar268;
                          fStack_524 = fVar268;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_640._0_8_;
                          uStack_4f8 = local_640._8_8_;
                          uStack_4f0 = local_640._16_8_;
                          uStack_4e8 = local_640._24_8_;
                          local_4e0 = local_620;
                          auVar112 = vpcmpeqd_avx2(local_620,local_620);
                          local_918[1] = auVar112;
                          *local_918 = auVar112;
                          local_4c0 = pRVar14->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = pRVar14->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar259;
                          local_7e0 = local_660._0_8_;
                          uStack_7d8 = local_660._8_8_;
                          uStack_7d0 = local_660._16_8_;
                          uStack_7c8 = local_660._24_8_;
                          local_990.valid = (int *)&local_7e0;
                          local_990.geometryUserPtr = pGVar10->userPtr;
                          local_990.context = context->user;
                          local_990.hit = local_5a0;
                          local_990.N = 8;
                          local_990.ray = (RTCRayN *)ray;
                          if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar264 = ZEXT1664(local_8a0._0_16_);
                            auVar275 = ZEXT1664(auVar99);
                            auVar277 = ZEXT1664(auVar102);
                            (*pGVar10->intersectionFilterN)(&local_990);
                            auVar263 = ZEXT1664(ZEXT416((uint)fVar259));
                            auVar269 = ZEXT1664(ZEXT416((uint)fVar268));
                            auVar279 = ZEXT3264(local_900);
                            auVar280 = ZEXT3264(local_8e0);
                            auVar240._8_4_ = 0x7fffffff;
                            auVar240._0_8_ = 0x7fffffff7fffffff;
                            auVar240._12_4_ = 0x7fffffff;
                          }
                          auVar70._8_8_ = uStack_7d8;
                          auVar70._0_8_ = local_7e0;
                          auVar70._16_8_ = uStack_7d0;
                          auVar70._24_8_ = uStack_7c8;
                          if (auVar70 != (undefined1  [32])0x0) {
                            p_Var15 = context->args->filter;
                            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar264 = ZEXT1664(auVar264._0_16_);
                              auVar275 = ZEXT1664(auVar275._0_16_);
                              auVar277 = ZEXT1664(auVar277._0_16_);
                              (*p_Var15)(&local_990);
                              auVar263 = ZEXT1664(ZEXT416((uint)fVar259));
                              auVar269 = ZEXT1664(ZEXT416((uint)fVar268));
                              auVar279 = ZEXT3264(local_900);
                              auVar280 = ZEXT3264(local_8e0);
                              auVar240._8_4_ = 0x7fffffff;
                              auVar240._0_8_ = 0x7fffffff7fffffff;
                              auVar240._12_4_ = 0x7fffffff;
                            }
                            auVar71._8_8_ = uStack_7d8;
                            auVar71._0_8_ = local_7e0;
                            auVar71._16_8_ = uStack_7d0;
                            auVar71._24_8_ = uStack_7c8;
                            if (auVar71 != (undefined1  [32])0x0) {
                              uVar95 = vptestmd_avx512vl(auVar71,auVar71);
                              iVar3 = *(int *)(local_990.hit + 4);
                              iVar4 = *(int *)(local_990.hit + 8);
                              iVar1 = *(int *)(local_990.hit + 0xc);
                              iVar66 = *(int *)(local_990.hit + 0x10);
                              iVar67 = *(int *)(local_990.hit + 0x14);
                              iVar68 = *(int *)(local_990.hit + 0x18);
                              iVar69 = *(int *)(local_990.hit + 0x1c);
                              bVar85 = (byte)uVar95;
                              bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                              bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                              bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                              bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                              bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                              bVar22 = SUB81(uVar95 >> 7,0);
                              *(uint *)(local_990.ray + 0x180) =
                                   (uint)(bVar85 & 1) * *(int *)local_990.hit |
                                   (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x180);
                              *(uint *)(local_990.ray + 0x184) =
                                   (uint)bVar94 * iVar3 |
                                   (uint)!bVar94 * *(int *)(local_990.ray + 0x184);
                              *(uint *)(local_990.ray + 0x188) =
                                   (uint)bVar17 * iVar4 |
                                   (uint)!bVar17 * *(int *)(local_990.ray + 0x188);
                              *(uint *)(local_990.ray + 0x18c) =
                                   (uint)bVar18 * iVar1 |
                                   (uint)!bVar18 * *(int *)(local_990.ray + 0x18c);
                              *(uint *)(local_990.ray + 400) =
                                   (uint)bVar19 * iVar66 |
                                   (uint)!bVar19 * *(int *)(local_990.ray + 400);
                              *(uint *)(local_990.ray + 0x194) =
                                   (uint)bVar20 * iVar67 |
                                   (uint)!bVar20 * *(int *)(local_990.ray + 0x194);
                              *(uint *)(local_990.ray + 0x198) =
                                   (uint)bVar21 * iVar68 |
                                   (uint)!bVar21 * *(int *)(local_990.ray + 0x198);
                              *(uint *)(local_990.ray + 0x19c) =
                                   (uint)bVar22 * iVar69 |
                                   (uint)!bVar22 * *(int *)(local_990.ray + 0x19c);
                              iVar3 = *(int *)(local_990.hit + 0x24);
                              iVar4 = *(int *)(local_990.hit + 0x28);
                              iVar1 = *(int *)(local_990.hit + 0x2c);
                              iVar66 = *(int *)(local_990.hit + 0x30);
                              iVar67 = *(int *)(local_990.hit + 0x34);
                              iVar68 = *(int *)(local_990.hit + 0x38);
                              iVar69 = *(int *)(local_990.hit + 0x3c);
                              bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                              bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                              bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                              bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                              bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                              bVar22 = SUB81(uVar95 >> 7,0);
                              *(uint *)(local_990.ray + 0x1a0) =
                                   (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x20) |
                                   (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1a0);
                              *(uint *)(local_990.ray + 0x1a4) =
                                   (uint)bVar94 * iVar3 |
                                   (uint)!bVar94 * *(int *)(local_990.ray + 0x1a4);
                              *(uint *)(local_990.ray + 0x1a8) =
                                   (uint)bVar17 * iVar4 |
                                   (uint)!bVar17 * *(int *)(local_990.ray + 0x1a8);
                              *(uint *)(local_990.ray + 0x1ac) =
                                   (uint)bVar18 * iVar1 |
                                   (uint)!bVar18 * *(int *)(local_990.ray + 0x1ac);
                              *(uint *)(local_990.ray + 0x1b0) =
                                   (uint)bVar19 * iVar66 |
                                   (uint)!bVar19 * *(int *)(local_990.ray + 0x1b0);
                              *(uint *)(local_990.ray + 0x1b4) =
                                   (uint)bVar20 * iVar67 |
                                   (uint)!bVar20 * *(int *)(local_990.ray + 0x1b4);
                              *(uint *)(local_990.ray + 0x1b8) =
                                   (uint)bVar21 * iVar68 |
                                   (uint)!bVar21 * *(int *)(local_990.ray + 0x1b8);
                              *(uint *)(local_990.ray + 0x1bc) =
                                   (uint)bVar22 * iVar69 |
                                   (uint)!bVar22 * *(int *)(local_990.ray + 0x1bc);
                              iVar3 = *(int *)(local_990.hit + 0x44);
                              iVar4 = *(int *)(local_990.hit + 0x48);
                              iVar1 = *(int *)(local_990.hit + 0x4c);
                              iVar66 = *(int *)(local_990.hit + 0x50);
                              iVar67 = *(int *)(local_990.hit + 0x54);
                              iVar68 = *(int *)(local_990.hit + 0x58);
                              iVar69 = *(int *)(local_990.hit + 0x5c);
                              bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                              bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                              bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                              bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                              bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                              bVar22 = SUB81(uVar95 >> 7,0);
                              *(uint *)(local_990.ray + 0x1c0) =
                                   (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x40) |
                                   (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1c0);
                              *(uint *)(local_990.ray + 0x1c4) =
                                   (uint)bVar94 * iVar3 |
                                   (uint)!bVar94 * *(int *)(local_990.ray + 0x1c4);
                              *(uint *)(local_990.ray + 0x1c8) =
                                   (uint)bVar17 * iVar4 |
                                   (uint)!bVar17 * *(int *)(local_990.ray + 0x1c8);
                              *(uint *)(local_990.ray + 0x1cc) =
                                   (uint)bVar18 * iVar1 |
                                   (uint)!bVar18 * *(int *)(local_990.ray + 0x1cc);
                              *(uint *)(local_990.ray + 0x1d0) =
                                   (uint)bVar19 * iVar66 |
                                   (uint)!bVar19 * *(int *)(local_990.ray + 0x1d0);
                              *(uint *)(local_990.ray + 0x1d4) =
                                   (uint)bVar20 * iVar67 |
                                   (uint)!bVar20 * *(int *)(local_990.ray + 0x1d4);
                              *(uint *)(local_990.ray + 0x1d8) =
                                   (uint)bVar21 * iVar68 |
                                   (uint)!bVar21 * *(int *)(local_990.ray + 0x1d8);
                              *(uint *)(local_990.ray + 0x1dc) =
                                   (uint)bVar22 * iVar69 |
                                   (uint)!bVar22 * *(int *)(local_990.ray + 0x1dc);
                              iVar3 = *(int *)(local_990.hit + 100);
                              iVar4 = *(int *)(local_990.hit + 0x68);
                              iVar1 = *(int *)(local_990.hit + 0x6c);
                              iVar66 = *(int *)(local_990.hit + 0x70);
                              iVar67 = *(int *)(local_990.hit + 0x74);
                              iVar68 = *(int *)(local_990.hit + 0x78);
                              iVar69 = *(int *)(local_990.hit + 0x7c);
                              bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                              bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                              bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                              bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                              bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                              bVar22 = SUB81(uVar95 >> 7,0);
                              *(uint *)(local_990.ray + 0x1e0) =
                                   (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x60) |
                                   (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x1e0);
                              *(uint *)(local_990.ray + 0x1e4) =
                                   (uint)bVar94 * iVar3 |
                                   (uint)!bVar94 * *(int *)(local_990.ray + 0x1e4);
                              *(uint *)(local_990.ray + 0x1e8) =
                                   (uint)bVar17 * iVar4 |
                                   (uint)!bVar17 * *(int *)(local_990.ray + 0x1e8);
                              *(uint *)(local_990.ray + 0x1ec) =
                                   (uint)bVar18 * iVar1 |
                                   (uint)!bVar18 * *(int *)(local_990.ray + 0x1ec);
                              *(uint *)(local_990.ray + 0x1f0) =
                                   (uint)bVar19 * iVar66 |
                                   (uint)!bVar19 * *(int *)(local_990.ray + 0x1f0);
                              *(uint *)(local_990.ray + 500) =
                                   (uint)bVar20 * iVar67 |
                                   (uint)!bVar20 * *(int *)(local_990.ray + 500);
                              *(uint *)(local_990.ray + 0x1f8) =
                                   (uint)bVar21 * iVar68 |
                                   (uint)!bVar21 * *(int *)(local_990.ray + 0x1f8);
                              *(uint *)(local_990.ray + 0x1fc) =
                                   (uint)bVar22 * iVar69 |
                                   (uint)!bVar22 * *(int *)(local_990.ray + 0x1fc);
                              iVar3 = *(int *)(local_990.hit + 0x84);
                              iVar4 = *(int *)(local_990.hit + 0x88);
                              iVar1 = *(int *)(local_990.hit + 0x8c);
                              iVar66 = *(int *)(local_990.hit + 0x90);
                              iVar67 = *(int *)(local_990.hit + 0x94);
                              iVar68 = *(int *)(local_990.hit + 0x98);
                              iVar69 = *(int *)(local_990.hit + 0x9c);
                              bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                              bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                              bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                              bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                              bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                              bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                              bVar22 = SUB81(uVar95 >> 7,0);
                              *(uint *)(local_990.ray + 0x200) =
                                   (uint)(bVar85 & 1) * *(int *)(local_990.hit + 0x80) |
                                   (uint)!(bool)(bVar85 & 1) * *(int *)(local_990.ray + 0x200);
                              *(uint *)(local_990.ray + 0x204) =
                                   (uint)bVar94 * iVar3 |
                                   (uint)!bVar94 * *(int *)(local_990.ray + 0x204);
                              *(uint *)(local_990.ray + 0x208) =
                                   (uint)bVar17 * iVar4 |
                                   (uint)!bVar17 * *(int *)(local_990.ray + 0x208);
                              *(uint *)(local_990.ray + 0x20c) =
                                   (uint)bVar18 * iVar1 |
                                   (uint)!bVar18 * *(int *)(local_990.ray + 0x20c);
                              *(uint *)(local_990.ray + 0x210) =
                                   (uint)bVar19 * iVar66 |
                                   (uint)!bVar19 * *(int *)(local_990.ray + 0x210);
                              *(uint *)(local_990.ray + 0x214) =
                                   (uint)bVar20 * iVar67 |
                                   (uint)!bVar20 * *(int *)(local_990.ray + 0x214);
                              *(uint *)(local_990.ray + 0x218) =
                                   (uint)bVar21 * iVar68 |
                                   (uint)!bVar21 * *(int *)(local_990.ray + 0x218);
                              *(uint *)(local_990.ray + 0x21c) =
                                   (uint)bVar22 * iVar69 |
                                   (uint)!bVar22 * *(int *)(local_990.ray + 0x21c);
                              auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                             (local_990.hit + 0xa0));
                              *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar112;
                              auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                             (local_990.hit + 0xc0));
                              *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar112;
                              auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                             (local_990.hit + 0xe0));
                              *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar112;
                              auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                             (local_990.hit + 0x100));
                              *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar112;
                              goto LAB_01e9d992;
                            }
                          }
                          auVar254 = ZEXT464((uint)fVar260);
                          *(float *)(ray + k * 4 + 0x100) = fVar260;
                        }
                      }
                    }
                  }
                }
                bVar94 = lVar93 != 0;
                lVar93 = lVar93 + -1;
              } while ((!bVar16) && (bVar94));
              auVar76._4_4_ = fStack_6bc;
              auVar76._0_4_ = local_6c0;
              auVar76._8_4_ = fStack_6b8;
              auVar76._12_4_ = fStack_6b4;
              auVar76._16_4_ = fStack_6b0;
              auVar76._20_4_ = fStack_6ac;
              auVar76._24_4_ = fStack_6a8;
              auVar76._28_4_ = fStack_6a4;
              uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar36._4_4_ = uVar162;
              auVar36._0_4_ = uVar162;
              auVar36._8_4_ = uVar162;
              auVar36._12_4_ = uVar162;
              auVar36._16_4_ = uVar162;
              auVar36._20_4_ = uVar162;
              auVar36._24_4_ = uVar162;
              auVar36._28_4_ = uVar162;
              uVar26 = vcmpps_avx512vl(auVar76,auVar36,2);
              bVar89 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar89 & (byte)uVar26;
            } while (bVar89 != 0);
          }
          auVar176._0_4_ = (float)local_6e0._0_4_ + (float)local_700._0_4_;
          auVar176._4_4_ = (float)local_6e0._4_4_ + (float)local_700._4_4_;
          auVar176._8_4_ = fStack_6d8 + fStack_6f8;
          auVar176._12_4_ = fStack_6d4 + fStack_6f4;
          auVar176._16_4_ = fStack_6d0 + fStack_6f0;
          auVar176._20_4_ = fStack_6cc + fStack_6ec;
          auVar176._24_4_ = fStack_6c8 + fStack_6e8;
          auVar176._28_4_ = fStack_6c4 + fStack_6e4;
          uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar37._4_4_ = uVar162;
          auVar37._0_4_ = uVar162;
          auVar37._8_4_ = uVar162;
          auVar37._12_4_ = uVar162;
          auVar37._16_4_ = uVar162;
          auVar37._20_4_ = uVar162;
          auVar37._24_4_ = uVar162;
          auVar37._28_4_ = uVar162;
          uVar26 = vcmpps_avx512vl(auVar176,auVar37,2);
          bVar90 = (byte)uVar24 | ~bVar90;
          bVar83 = (byte)uVar25 & bVar83 & (byte)uVar26;
          auVar177._8_4_ = 2;
          auVar177._0_8_ = 0x200000002;
          auVar177._12_4_ = 2;
          auVar177._16_4_ = 2;
          auVar177._20_4_ = 2;
          auVar177._24_4_ = 2;
          auVar177._28_4_ = 2;
          auVar38._8_4_ = 3;
          auVar38._0_8_ = 0x300000003;
          auVar38._12_4_ = 3;
          auVar38._16_4_ = 3;
          auVar38._20_4_ = 3;
          auVar38._24_4_ = 3;
          auVar38._28_4_ = 3;
          auVar112 = vpblendmd_avx512vl(auVar177,auVar38);
          local_6e0._0_4_ = (uint)(bVar90 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar90 & 1) * 2;
          bVar16 = (bool)(bVar90 >> 1 & 1);
          local_6e0._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 2;
          bVar16 = (bool)(bVar90 >> 2 & 1);
          fStack_6d8 = (float)((uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 2);
          bVar16 = (bool)(bVar90 >> 3 & 1);
          fStack_6d4 = (float)((uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 2);
          bVar16 = (bool)(bVar90 >> 4 & 1);
          fStack_6d0 = (float)((uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 2);
          bVar16 = (bool)(bVar90 >> 5 & 1);
          fStack_6cc = (float)((uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 2);
          bVar16 = (bool)(bVar90 >> 6 & 1);
          fStack_6c8 = (float)((uint)bVar16 * auVar112._24_4_ | (uint)!bVar16 * 2);
          fStack_6c4 = (float)((uint)(bVar90 >> 7) * auVar112._28_4_ |
                              (uint)!(bool)(bVar90 >> 7) * 2);
          uVar24 = vpcmpd_avx512vl(_local_6e0,local_600,2);
          bVar90 = (byte)uVar24 & bVar83;
          if (bVar90 != 0) {
            auVar100 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar107 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar101 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar99 = vminps_avx(auVar100,auVar101);
            auVar100 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar101 = vmaxps_avx(auVar107,auVar100);
            auVar107 = vandps_avx(auVar99,auVar240);
            auVar100 = vandps_avx(auVar101,auVar240);
            auVar107 = vmaxps_avx(auVar107,auVar100);
            auVar100 = vmovshdup_avx(auVar107);
            auVar100 = vmaxss_avx(auVar100,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar100);
            fVar160 = auVar107._0_4_ * 1.9073486e-06;
            local_7b0 = vshufps_avx(auVar101,auVar101,0xff);
            _local_720 = _local_480;
            local_6c0 = (float)local_480._0_4_ + (float)local_700._0_4_;
            fStack_6bc = (float)local_480._4_4_ + (float)local_700._4_4_;
            fStack_6b8 = fStack_478 + fStack_6f8;
            fStack_6b4 = fStack_474 + fStack_6f4;
            fStack_6b0 = fStack_470 + fStack_6f0;
            fStack_6ac = fStack_46c + fStack_6ec;
            fStack_6a8 = fStack_468 + fStack_6e8;
            fStack_6a4 = fStack_464 + fStack_6e4;
            do {
              auVar178._8_4_ = 0x7f800000;
              auVar178._0_8_ = 0x7f8000007f800000;
              auVar178._12_4_ = 0x7f800000;
              auVar178._16_4_ = 0x7f800000;
              auVar178._20_4_ = 0x7f800000;
              auVar178._24_4_ = 0x7f800000;
              auVar178._28_4_ = 0x7f800000;
              auVar112 = vblendmps_avx512vl(auVar178,_local_720);
              auVar149._0_4_ =
                   (uint)(bVar90 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar90 >> 1 & 1);
              auVar149._4_4_ = (uint)bVar16 * auVar112._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar90 >> 2 & 1);
              auVar149._8_4_ = (uint)bVar16 * auVar112._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar90 >> 3 & 1);
              auVar149._12_4_ = (uint)bVar16 * auVar112._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar90 >> 4 & 1);
              auVar149._16_4_ = (uint)bVar16 * auVar112._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar90 >> 5 & 1);
              auVar149._20_4_ = (uint)bVar16 * auVar112._20_4_ | (uint)!bVar16 * 0x7f800000;
              auVar149._24_4_ =
                   (uint)(bVar90 >> 6) * auVar112._24_4_ | (uint)!(bool)(bVar90 >> 6) * 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar112 = vshufps_avx(auVar149,auVar149,0xb1);
              auVar112 = vminps_avx(auVar149,auVar112);
              auVar111 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar111);
              auVar111 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar111);
              uVar24 = vcmpps_avx512vl(auVar149,auVar112,0);
              bVar85 = (byte)uVar24 & bVar90;
              bVar89 = bVar90;
              if (bVar85 != 0) {
                bVar89 = bVar85;
              }
              iVar2 = 0;
              for (uVar96 = (uint)bVar89; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar96 = *(uint *)(local_6a0 + (uint)(iVar2 << 2));
              uVar153 = *(uint *)(local_460 + (uint)(iVar2 << 2));
              fVar258 = auVar97._0_4_;
              if ((float)local_880._0_4_ < 0.0) {
                fVar258 = sqrtf((float)local_880._0_4_);
              }
              auVar269 = ZEXT464(uVar96);
              auVar263 = ZEXT464(uVar153);
              lVar93 = 4;
              do {
                fVar259 = auVar263._0_4_;
                auVar167._4_4_ = fVar259;
                auVar167._0_4_ = fVar259;
                auVar167._8_4_ = fVar259;
                auVar167._12_4_ = fVar259;
                auVar107 = vfmadd132ps_fma(auVar167,ZEXT816(0) << 0x40,local_870);
                fVar268 = auVar269._0_4_;
                fVar251 = 1.0 - fVar268;
                fVar266 = fVar251 * fVar251 * fVar251;
                fVar260 = fVar268 * fVar268;
                fVar226 = fVar268 * fVar260;
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar266),
                                           ZEXT416((uint)fVar226));
                fVar265 = fVar268 * fVar251;
                auVar98 = ZEXT416((uint)fVar251);
                auVar99 = vfmadd231ss_fma(ZEXT416((uint)(fVar268 * fVar265 * 6.0)),
                                          ZEXT416((uint)(fVar265 * fVar251)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                           ZEXT416((uint)fVar266));
                auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar251 * 6.0)),
                                         SUB6416(ZEXT464(0x41400000),0),
                                         ZEXT416((uint)(fVar268 * fVar265)));
                fVar266 = fVar266 * 0.16666667;
                fVar267 = (auVar100._0_4_ + auVar99._0_4_) * 0.16666667;
                fVar185 = (auVar101._0_4_ + auVar6._0_4_) * 0.16666667;
                fVar226 = fVar226 * 0.16666667;
                auVar213._0_4_ = fVar226 * (float)local_860._0_4_;
                auVar213._4_4_ = fVar226 * (float)local_860._4_4_;
                auVar213._8_4_ = fVar226 * fStack_858;
                auVar213._12_4_ = fVar226 * fStack_854;
                auVar243._4_4_ = fVar185;
                auVar243._0_4_ = fVar185;
                auVar243._8_4_ = fVar185;
                auVar243._12_4_ = fVar185;
                auVar100 = vfmadd132ps_fma(auVar243,auVar213,local_820._0_16_);
                auVar214._4_4_ = fVar267;
                auVar214._0_4_ = fVar267;
                auVar214._8_4_ = fVar267;
                auVar214._12_4_ = fVar267;
                auVar100 = vfmadd132ps_fma(auVar214,auVar100,local_840._0_16_);
                auVar194._4_4_ = fVar266;
                auVar194._0_4_ = fVar266;
                auVar194._8_4_ = fVar266;
                auVar194._12_4_ = fVar266;
                local_740 = vfmadd132ps_fma(auVar194,auVar100,local_800._0_16_);
                auVar107 = vsubps_avx(auVar107,local_740);
                local_8a0._0_16_ = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar100 = auVar269._0_16_;
                local_8c0._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_960._0_4_ = fVar260;
                  auVar277._0_4_ = sqrtf(auVar107._0_4_);
                  auVar277._4_60_ = extraout_var_00;
                  auVar107 = auVar277._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  local_960._0_4_ = fVar260;
                }
                auVar99 = vfnmsub213ss_fma(auVar100,auVar100,ZEXT416((uint)(fVar265 * 4.0)));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * 4.0)),auVar98,auVar98);
                fVar260 = fVar251 * -fVar251 * 0.5;
                fVar265 = auVar99._0_4_ * 0.5;
                fVar266 = auVar101._0_4_ * 0.5;
                local_960._0_4_ = (float)local_960._0_4_ * 0.5;
                auVar231._0_4_ = (float)local_960._0_4_ * (float)local_860._0_4_;
                auVar231._4_4_ = (float)local_960._0_4_ * (float)local_860._4_4_;
                auVar231._8_4_ = (float)local_960._0_4_ * fStack_858;
                auVar231._12_4_ = (float)local_960._0_4_ * fStack_854;
                auVar195._4_4_ = fVar266;
                auVar195._0_4_ = fVar266;
                auVar195._8_4_ = fVar266;
                auVar195._12_4_ = fVar266;
                auVar101 = vfmadd132ps_fma(auVar195,auVar231,local_820._0_16_);
                auVar215._4_4_ = fVar265;
                auVar215._0_4_ = fVar265;
                auVar215._8_4_ = fVar265;
                auVar215._12_4_ = fVar265;
                auVar101 = vfmadd132ps_fma(auVar215,auVar101,local_840._0_16_);
                auVar273._4_4_ = fVar260;
                auVar273._0_4_ = fVar260;
                auVar273._8_4_ = fVar260;
                auVar273._12_4_ = fVar260;
                local_960._0_16_ = vfmadd132ps_fma(auVar273,auVar101,local_800._0_16_);
                local_760 = vdpps_avx(local_960._0_16_,local_960._0_16_,0x7f);
                auVar65._12_4_ = 0;
                auVar65._0_12_ = ZEXT812(0);
                fVar260 = local_760._0_4_;
                auVar101 = vrsqrt14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar260));
                fVar265 = auVar101._0_4_;
                local_770 = vrcp14ss_avx512f(auVar65 << 0x20,ZEXT416((uint)fVar260));
                auVar101 = vfnmadd213ss_fma(local_770,local_760,ZEXT416(0x40000000));
                uVar96 = auVar107._0_4_;
                local_750 = fVar251;
                fStack_74c = fVar251;
                fStack_748 = fVar251;
                fStack_744 = fVar251;
                if (fVar260 < -fVar260) {
                  fVar266 = sqrtf(fVar260);
                  auVar107 = ZEXT416(uVar96);
                  auVar99 = local_960._0_16_;
                }
                else {
                  auVar99 = vsqrtss_avx(local_760,local_760);
                  fVar266 = auVar99._0_4_;
                  auVar99 = local_960._0_16_;
                }
                fVar260 = fVar265 * 1.5 + fVar260 * -0.5 * fVar265 * fVar265 * fVar265;
                auVar168._0_4_ = auVar99._0_4_ * fVar260;
                auVar168._4_4_ = auVar99._4_4_ * fVar260;
                auVar168._8_4_ = auVar99._8_4_ * fVar260;
                auVar168._12_4_ = auVar99._12_4_ * fVar260;
                auVar6 = vdpps_avx(local_8a0._0_16_,auVar168,0x7f);
                fVar185 = auVar107._0_4_;
                fVar265 = auVar6._0_4_;
                auVar169._0_4_ = fVar265 * fVar265;
                auVar169._4_4_ = auVar6._4_4_ * auVar6._4_4_;
                auVar169._8_4_ = auVar6._8_4_ * auVar6._8_4_;
                auVar169._12_4_ = auVar6._12_4_ * auVar6._12_4_;
                auVar102 = vsubps_avx512vl(local_8c0._0_16_,auVar169);
                fVar267 = auVar102._0_4_;
                auVar196._4_12_ = ZEXT812(0) << 0x20;
                auVar196._0_4_ = fVar267;
                auVar103 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar196);
                auVar104 = vmulss_avx512f(auVar103,ZEXT416(0x3fc00000));
                auVar105 = vmulss_avx512f(auVar102,ZEXT416(0xbf000000));
                if (fVar267 < 0.0) {
                  local_790 = fVar260;
                  fStack_78c = fVar260;
                  fStack_788 = fVar260;
                  fStack_784 = fVar260;
                  local_780 = auVar103;
                  fVar267 = sqrtf(fVar267);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar104 = ZEXT416(auVar104._0_4_);
                  auVar107 = ZEXT416(uVar96);
                  auVar99 = local_960._0_16_;
                  auVar103 = local_780;
                  fVar260 = local_790;
                  fVar226 = fStack_78c;
                  fVar251 = fStack_788;
                  fVar252 = fStack_784;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar102,auVar102);
                  fVar267 = auVar102._0_4_;
                  fVar226 = fVar260;
                  fVar251 = fVar260;
                  fVar252 = fVar260;
                }
                auVar275 = ZEXT1664(auVar99);
                auVar264 = ZEXT1664(local_8a0._0_16_);
                auVar280 = ZEXT3264(local_8e0);
                auVar279 = ZEXT3264(local_900);
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,auVar100);
                auVar100 = vfmadd231ss_fma(auVar98,auVar100,SUB6416(ZEXT464(0xc0000000),0));
                auVar216._0_4_ = fVar268 * (float)local_860._0_4_;
                auVar216._4_4_ = fVar268 * (float)local_860._4_4_;
                auVar216._8_4_ = fVar268 * fStack_858;
                auVar216._12_4_ = fVar268 * fStack_854;
                auVar232._0_4_ = auVar100._0_4_;
                auVar232._4_4_ = auVar232._0_4_;
                auVar232._8_4_ = auVar232._0_4_;
                auVar232._12_4_ = auVar232._0_4_;
                auVar100 = vfmadd132ps_fma(auVar232,auVar216,local_820._0_16_);
                auVar197._0_4_ = auVar102._0_4_;
                auVar197._4_4_ = auVar197._0_4_;
                auVar197._8_4_ = auVar197._0_4_;
                auVar197._12_4_ = auVar197._0_4_;
                auVar100 = vfmadd132ps_fma(auVar197,auVar100,local_840._0_16_);
                auVar75._4_4_ = fStack_74c;
                auVar75._0_4_ = local_750;
                auVar75._8_4_ = fStack_748;
                auVar75._12_4_ = fStack_744;
                auVar100 = vfmadd132ps_fma(auVar75,auVar100,local_800._0_16_);
                auVar198._0_4_ = auVar100._0_4_ * (float)local_760._0_4_;
                auVar198._4_4_ = auVar100._4_4_ * (float)local_760._0_4_;
                auVar198._8_4_ = auVar100._8_4_ * (float)local_760._0_4_;
                auVar198._12_4_ = auVar100._12_4_ * (float)local_760._0_4_;
                auVar100 = vdpps_avx(auVar99,auVar100,0x7f);
                fVar207 = auVar100._0_4_;
                auVar217._0_4_ = auVar99._0_4_ * fVar207;
                auVar217._4_4_ = auVar99._4_4_ * fVar207;
                auVar217._8_4_ = auVar99._8_4_ * fVar207;
                auVar217._12_4_ = auVar99._12_4_ * fVar207;
                auVar100 = vsubps_avx(auVar198,auVar217);
                fVar207 = auVar101._0_4_ * (float)local_770._0_4_;
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar151._16_16_ = local_900._16_16_;
                auVar106 = vxorps_avx512vl(auVar99,auVar28);
                auVar244._0_4_ = fVar260 * auVar100._0_4_ * fVar207;
                auVar244._4_4_ = fVar226 * auVar100._4_4_ * fVar207;
                auVar244._8_4_ = fVar251 * auVar100._8_4_ * fVar207;
                auVar244._12_4_ = fVar252 * auVar100._12_4_ * fVar207;
                auVar100 = vdpps_avx(auVar106,auVar168,0x7f);
                auVar98 = vmaxss_avx(ZEXT416((uint)fVar160),
                                     ZEXT416((uint)(fVar259 * fVar258 * 1.9073486e-06)));
                auVar101 = vdpps_avx(local_8a0._0_16_,auVar244,0x7f);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar160),auVar98);
                auVar102 = vfmadd213ss_fma(ZEXT416((uint)(fVar185 + 1.0)),
                                           ZEXT416((uint)(fVar160 / fVar266)),auVar107);
                auVar277 = ZEXT1664(auVar102);
                auVar107 = vdpps_avx(local_870,auVar168,0x7f);
                fVar260 = auVar100._0_4_ + auVar101._0_4_;
                auVar100 = vdpps_avx(local_8a0._0_16_,auVar106,0x7f);
                auVar105 = vmulss_avx512f(auVar105,auVar103);
                auVar103 = vmulss_avx512f(auVar103,auVar103);
                auVar101 = vdpps_avx(local_8a0._0_16_,local_870,0x7f);
                auVar105 = vaddss_avx512f(auVar104,ZEXT416((uint)(auVar105._0_4_ * auVar103._0_4_)))
                ;
                auVar103 = vfnmadd231ss_fma(auVar100,auVar6,ZEXT416((uint)fVar260));
                auVar104 = vfnmadd231ss_fma(auVar101,auVar6,auVar107);
                auVar100 = vpermilps_avx(local_740,0xff);
                fVar267 = fVar267 - auVar100._0_4_;
                auVar100 = vshufps_avx(auVar99,auVar99,0xff);
                auVar101 = vfmsub213ss_fma(auVar103,auVar105,auVar100);
                fVar266 = auVar104._0_4_ * auVar105._0_4_;
                auVar103 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar101._0_4_)),
                                           ZEXT416((uint)fVar260),ZEXT416((uint)fVar266));
                fVar226 = auVar103._0_4_;
                fVar185 = fVar265 * (auVar101._0_4_ / fVar226);
                auVar254 = ZEXT464((uint)fVar185);
                fVar268 = fVar268 - (fVar265 * (fVar266 / fVar226) -
                                    fVar267 * (auVar107._0_4_ / fVar226));
                auVar269 = ZEXT464((uint)fVar268);
                fVar259 = fVar259 - (fVar267 * (fVar260 / fVar226) - fVar185);
                auVar263 = ZEXT464((uint)fVar259);
                auVar245._8_4_ = 0x7fffffff;
                auVar245._0_8_ = 0x7fffffff7fffffff;
                auVar245._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx(auVar6,auVar245);
                if (auVar102._0_4_ <= auVar107._0_4_) {
LAB_01e9e2b2:
                  bVar16 = false;
                }
                else {
                  auVar101 = vfmadd231ss_fma(ZEXT416((uint)(auVar102._0_4_ + auVar98._0_4_)),
                                             local_7b0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(ZEXT416((uint)fVar267),auVar245);
                  if (auVar101._0_4_ <= auVar107._0_4_) goto LAB_01e9e2b2;
                  fVar259 = fVar259 + (float)local_7a0._0_4_;
                  auVar263 = ZEXT464((uint)fVar259);
                  bVar16 = true;
                  if ((((fVar227 <= fVar259) &&
                       (fVar260 = *(float *)(ray + k * 4 + 0x100), fVar259 <= fVar260)) &&
                      (0.0 <= fVar268)) && (fVar268 <= 1.0)) {
                    auVar151._0_16_ = ZEXT816(0) << 0x20;
                    auVar150._4_28_ = auVar151._4_28_;
                    auVar150._0_4_ = local_8c0._0_4_;
                    auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar150._0_16_);
                    fVar265 = auVar107._0_4_;
                    auVar107 = vmulss_avx512f(local_8c0._0_16_,ZEXT416(0xbf000000));
                    pGVar10 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      fVar265 = fVar265 * 1.5 + auVar107._0_4_ * fVar265 * fVar265 * fVar265;
                      auVar199._0_4_ = local_8a0._0_4_ * fVar265;
                      auVar199._4_4_ = local_8a0._4_4_ * fVar265;
                      auVar199._8_4_ = local_8a0._8_4_ * fVar265;
                      auVar199._12_4_ = local_8a0._12_4_ * fVar265;
                      auVar6 = vfmadd213ps_fma(auVar100,auVar199,auVar99);
                      auVar107 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar100 = vshufps_avx(auVar99,auVar99,0xc9);
                      auVar200._0_4_ = auVar199._0_4_ * auVar100._0_4_;
                      auVar200._4_4_ = auVar199._4_4_ * auVar100._4_4_;
                      auVar200._8_4_ = auVar199._8_4_ * auVar100._8_4_;
                      auVar200._12_4_ = auVar199._12_4_ * auVar100._12_4_;
                      auVar101 = vfmsub231ps_fma(auVar200,auVar99,auVar107);
                      auVar107 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar100 = vshufps_avx(auVar6,auVar6,0xc9);
                      auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                      auVar170._0_4_ = auVar6._0_4_ * auVar101._0_4_;
                      auVar170._4_4_ = auVar6._4_4_ * auVar101._4_4_;
                      auVar170._8_4_ = auVar6._8_4_ * auVar101._8_4_;
                      auVar170._12_4_ = auVar6._12_4_ * auVar101._12_4_;
                      auVar107 = vfmsub231ps_fma(auVar170,auVar107,auVar100);
                      uVar162 = auVar107._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = fVar259;
                        uVar9 = vextractps_avx(auVar107,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar9;
                        uVar9 = vextractps_avx(auVar107,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar9;
                        *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar162;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar268;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(uint *)(ray + k * 4 + 0x220) = uVar8;
                        *(uint *)(ray + k * 4 + 0x240) = uVar88;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar14 = context->user;
                        auVar220._8_4_ = 1;
                        auVar220._0_8_ = 0x100000001;
                        auVar220._12_4_ = 1;
                        auVar220._16_4_ = 1;
                        auVar220._20_4_ = 1;
                        auVar220._24_4_ = 1;
                        auVar220._28_4_ = 1;
                        auVar112 = vpermps_avx2(auVar220,ZEXT1632(auVar107));
                        auVar237._8_4_ = 2;
                        auVar237._0_8_ = 0x200000002;
                        auVar237._12_4_ = 2;
                        auVar237._16_4_ = 2;
                        auVar237._20_4_ = 2;
                        auVar237._24_4_ = 2;
                        auVar237._28_4_ = 2;
                        local_580 = vpermps_avx2(auVar237,ZEXT1632(auVar107));
                        local_5a0[0] = (RTCHitN)auVar112[0];
                        local_5a0[1] = (RTCHitN)auVar112[1];
                        local_5a0[2] = (RTCHitN)auVar112[2];
                        local_5a0[3] = (RTCHitN)auVar112[3];
                        local_5a0[4] = (RTCHitN)auVar112[4];
                        local_5a0[5] = (RTCHitN)auVar112[5];
                        local_5a0[6] = (RTCHitN)auVar112[6];
                        local_5a0[7] = (RTCHitN)auVar112[7];
                        local_5a0[8] = (RTCHitN)auVar112[8];
                        local_5a0[9] = (RTCHitN)auVar112[9];
                        local_5a0[10] = (RTCHitN)auVar112[10];
                        local_5a0[0xb] = (RTCHitN)auVar112[0xb];
                        local_5a0[0xc] = (RTCHitN)auVar112[0xc];
                        local_5a0[0xd] = (RTCHitN)auVar112[0xd];
                        local_5a0[0xe] = (RTCHitN)auVar112[0xe];
                        local_5a0[0xf] = (RTCHitN)auVar112[0xf];
                        local_5a0[0x10] = (RTCHitN)auVar112[0x10];
                        local_5a0[0x11] = (RTCHitN)auVar112[0x11];
                        local_5a0[0x12] = (RTCHitN)auVar112[0x12];
                        local_5a0[0x13] = (RTCHitN)auVar112[0x13];
                        local_5a0[0x14] = (RTCHitN)auVar112[0x14];
                        local_5a0[0x15] = (RTCHitN)auVar112[0x15];
                        local_5a0[0x16] = (RTCHitN)auVar112[0x16];
                        local_5a0[0x17] = (RTCHitN)auVar112[0x17];
                        local_5a0[0x18] = (RTCHitN)auVar112[0x18];
                        local_5a0[0x19] = (RTCHitN)auVar112[0x19];
                        local_5a0[0x1a] = (RTCHitN)auVar112[0x1a];
                        local_5a0[0x1b] = (RTCHitN)auVar112[0x1b];
                        local_5a0[0x1c] = (RTCHitN)auVar112[0x1c];
                        local_5a0[0x1d] = (RTCHitN)auVar112[0x1d];
                        local_5a0[0x1e] = (RTCHitN)auVar112[0x1e];
                        local_5a0[0x1f] = (RTCHitN)auVar112[0x1f];
                        local_560 = uVar162;
                        uStack_55c = uVar162;
                        uStack_558 = uVar162;
                        uStack_554 = uVar162;
                        uStack_550 = uVar162;
                        uStack_54c = uVar162;
                        uStack_548 = uVar162;
                        uStack_544 = uVar162;
                        local_540 = fVar268;
                        fStack_53c = fVar268;
                        fStack_538 = fVar268;
                        fStack_534 = fVar268;
                        fStack_530 = fVar268;
                        fStack_52c = fVar268;
                        fStack_528 = fVar268;
                        fStack_524 = fVar268;
                        local_520 = ZEXT432(0) << 0x20;
                        local_500 = local_640._0_8_;
                        uStack_4f8 = local_640._8_8_;
                        uStack_4f0 = local_640._16_8_;
                        uStack_4e8 = local_640._24_8_;
                        local_4e0 = local_620;
                        auVar112 = vpcmpeqd_avx2(local_620,local_620);
                        local_918[1] = auVar112;
                        *local_918 = auVar112;
                        local_4c0 = pRVar14->instID[0];
                        uStack_4bc = local_4c0;
                        uStack_4b8 = local_4c0;
                        uStack_4b4 = local_4c0;
                        uStack_4b0 = local_4c0;
                        uStack_4ac = local_4c0;
                        uStack_4a8 = local_4c0;
                        uStack_4a4 = local_4c0;
                        local_4a0 = pRVar14->instPrimID[0];
                        uStack_49c = local_4a0;
                        uStack_498 = local_4a0;
                        uStack_494 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_48c = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_484 = local_4a0;
                        *(float *)(ray + k * 4 + 0x100) = fVar259;
                        local_7e0 = local_660._0_8_;
                        uStack_7d8 = local_660._8_8_;
                        uStack_7d0 = local_660._16_8_;
                        uStack_7c8 = local_660._24_8_;
                        local_990.valid = (int *)&local_7e0;
                        local_990.geometryUserPtr = pGVar10->userPtr;
                        local_990.context = context->user;
                        local_990.hit = local_5a0;
                        local_990.N = 8;
                        local_990.ray = (RTCRayN *)ray;
                        if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar254 = ZEXT464((uint)fVar185);
                          auVar264 = ZEXT1664(local_8a0._0_16_);
                          auVar275 = ZEXT1664(auVar99);
                          auVar277 = ZEXT1664(auVar102);
                          (*pGVar10->intersectionFilterN)(&local_990);
                          auVar263 = ZEXT1664(ZEXT416((uint)fVar259));
                          auVar269 = ZEXT1664(ZEXT416((uint)fVar268));
                          auVar279 = ZEXT3264(local_900);
                          auVar280 = ZEXT3264(local_8e0);
                        }
                        auVar72._8_8_ = uStack_7d8;
                        auVar72._0_8_ = local_7e0;
                        auVar72._16_8_ = uStack_7d0;
                        auVar72._24_8_ = uStack_7c8;
                        if (auVar72 != (undefined1  [32])0x0) {
                          p_Var15 = context->args->filter;
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar254 = ZEXT1664(auVar254._0_16_);
                            auVar264 = ZEXT1664(auVar264._0_16_);
                            auVar275 = ZEXT1664(auVar275._0_16_);
                            auVar277 = ZEXT1664(auVar277._0_16_);
                            (*p_Var15)(&local_990);
                            auVar263 = ZEXT1664(ZEXT416((uint)fVar259));
                            auVar269 = ZEXT1664(ZEXT416((uint)fVar268));
                            auVar279 = ZEXT3264(local_900);
                            auVar280 = ZEXT3264(local_8e0);
                          }
                          auVar73._8_8_ = uStack_7d8;
                          auVar73._0_8_ = local_7e0;
                          auVar73._16_8_ = uStack_7d0;
                          auVar73._24_8_ = uStack_7c8;
                          if (auVar73 != (undefined1  [32])0x0) {
                            uVar95 = vptestmd_avx512vl(auVar73,auVar73);
                            iVar3 = *(int *)(local_990.hit + 4);
                            iVar4 = *(int *)(local_990.hit + 8);
                            iVar1 = *(int *)(local_990.hit + 0xc);
                            iVar66 = *(int *)(local_990.hit + 0x10);
                            iVar67 = *(int *)(local_990.hit + 0x14);
                            iVar68 = *(int *)(local_990.hit + 0x18);
                            iVar69 = *(int *)(local_990.hit + 0x1c);
                            bVar89 = (byte)uVar95;
                            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                            bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                            bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                            bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                            bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                            bVar22 = SUB81(uVar95 >> 7,0);
                            *(uint *)(local_990.ray + 0x180) =
                                 (uint)(bVar89 & 1) * *(int *)local_990.hit |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_990.ray + 0x180);
                            *(uint *)(local_990.ray + 0x184) =
                                 (uint)bVar94 * iVar3 |
                                 (uint)!bVar94 * *(int *)(local_990.ray + 0x184);
                            *(uint *)(local_990.ray + 0x188) =
                                 (uint)bVar17 * iVar4 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x188);
                            *(uint *)(local_990.ray + 0x18c) =
                                 (uint)bVar18 * iVar1 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x18c);
                            *(uint *)(local_990.ray + 400) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_990.ray + 400);
                            *(uint *)(local_990.ray + 0x194) =
                                 (uint)bVar20 * iVar67 |
                                 (uint)!bVar20 * *(int *)(local_990.ray + 0x194);
                            *(uint *)(local_990.ray + 0x198) =
                                 (uint)bVar21 * iVar68 |
                                 (uint)!bVar21 * *(int *)(local_990.ray + 0x198);
                            *(uint *)(local_990.ray + 0x19c) =
                                 (uint)bVar22 * iVar69 |
                                 (uint)!bVar22 * *(int *)(local_990.ray + 0x19c);
                            iVar3 = *(int *)(local_990.hit + 0x24);
                            iVar4 = *(int *)(local_990.hit + 0x28);
                            iVar1 = *(int *)(local_990.hit + 0x2c);
                            iVar66 = *(int *)(local_990.hit + 0x30);
                            iVar67 = *(int *)(local_990.hit + 0x34);
                            iVar68 = *(int *)(local_990.hit + 0x38);
                            iVar69 = *(int *)(local_990.hit + 0x3c);
                            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                            bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                            bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                            bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                            bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                            bVar22 = SUB81(uVar95 >> 7,0);
                            *(uint *)(local_990.ray + 0x1a0) =
                                 (uint)(bVar89 & 1) * *(int *)(local_990.hit + 0x20) |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_990.ray + 0x1a0);
                            *(uint *)(local_990.ray + 0x1a4) =
                                 (uint)bVar94 * iVar3 |
                                 (uint)!bVar94 * *(int *)(local_990.ray + 0x1a4);
                            *(uint *)(local_990.ray + 0x1a8) =
                                 (uint)bVar17 * iVar4 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1a8);
                            *(uint *)(local_990.ray + 0x1ac) =
                                 (uint)bVar18 * iVar1 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1ac);
                            *(uint *)(local_990.ray + 0x1b0) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_990.ray + 0x1b0);
                            *(uint *)(local_990.ray + 0x1b4) =
                                 (uint)bVar20 * iVar67 |
                                 (uint)!bVar20 * *(int *)(local_990.ray + 0x1b4);
                            *(uint *)(local_990.ray + 0x1b8) =
                                 (uint)bVar21 * iVar68 |
                                 (uint)!bVar21 * *(int *)(local_990.ray + 0x1b8);
                            *(uint *)(local_990.ray + 0x1bc) =
                                 (uint)bVar22 * iVar69 |
                                 (uint)!bVar22 * *(int *)(local_990.ray + 0x1bc);
                            iVar3 = *(int *)(local_990.hit + 0x44);
                            iVar4 = *(int *)(local_990.hit + 0x48);
                            iVar1 = *(int *)(local_990.hit + 0x4c);
                            iVar66 = *(int *)(local_990.hit + 0x50);
                            iVar67 = *(int *)(local_990.hit + 0x54);
                            iVar68 = *(int *)(local_990.hit + 0x58);
                            iVar69 = *(int *)(local_990.hit + 0x5c);
                            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                            bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                            bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                            bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                            bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                            bVar22 = SUB81(uVar95 >> 7,0);
                            *(uint *)(local_990.ray + 0x1c0) =
                                 (uint)(bVar89 & 1) * *(int *)(local_990.hit + 0x40) |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_990.ray + 0x1c0);
                            *(uint *)(local_990.ray + 0x1c4) =
                                 (uint)bVar94 * iVar3 |
                                 (uint)!bVar94 * *(int *)(local_990.ray + 0x1c4);
                            *(uint *)(local_990.ray + 0x1c8) =
                                 (uint)bVar17 * iVar4 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1c8);
                            *(uint *)(local_990.ray + 0x1cc) =
                                 (uint)bVar18 * iVar1 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1cc);
                            *(uint *)(local_990.ray + 0x1d0) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_990.ray + 0x1d0);
                            *(uint *)(local_990.ray + 0x1d4) =
                                 (uint)bVar20 * iVar67 |
                                 (uint)!bVar20 * *(int *)(local_990.ray + 0x1d4);
                            *(uint *)(local_990.ray + 0x1d8) =
                                 (uint)bVar21 * iVar68 |
                                 (uint)!bVar21 * *(int *)(local_990.ray + 0x1d8);
                            *(uint *)(local_990.ray + 0x1dc) =
                                 (uint)bVar22 * iVar69 |
                                 (uint)!bVar22 * *(int *)(local_990.ray + 0x1dc);
                            iVar3 = *(int *)(local_990.hit + 100);
                            iVar4 = *(int *)(local_990.hit + 0x68);
                            iVar1 = *(int *)(local_990.hit + 0x6c);
                            iVar66 = *(int *)(local_990.hit + 0x70);
                            iVar67 = *(int *)(local_990.hit + 0x74);
                            iVar68 = *(int *)(local_990.hit + 0x78);
                            iVar69 = *(int *)(local_990.hit + 0x7c);
                            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                            bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                            bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                            bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                            bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                            bVar22 = SUB81(uVar95 >> 7,0);
                            *(uint *)(local_990.ray + 0x1e0) =
                                 (uint)(bVar89 & 1) * *(int *)(local_990.hit + 0x60) |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_990.ray + 0x1e0);
                            *(uint *)(local_990.ray + 0x1e4) =
                                 (uint)bVar94 * iVar3 |
                                 (uint)!bVar94 * *(int *)(local_990.ray + 0x1e4);
                            *(uint *)(local_990.ray + 0x1e8) =
                                 (uint)bVar17 * iVar4 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x1e8);
                            *(uint *)(local_990.ray + 0x1ec) =
                                 (uint)bVar18 * iVar1 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x1ec);
                            *(uint *)(local_990.ray + 0x1f0) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_990.ray + 0x1f0);
                            *(uint *)(local_990.ray + 500) =
                                 (uint)bVar20 * iVar67 |
                                 (uint)!bVar20 * *(int *)(local_990.ray + 500);
                            *(uint *)(local_990.ray + 0x1f8) =
                                 (uint)bVar21 * iVar68 |
                                 (uint)!bVar21 * *(int *)(local_990.ray + 0x1f8);
                            *(uint *)(local_990.ray + 0x1fc) =
                                 (uint)bVar22 * iVar69 |
                                 (uint)!bVar22 * *(int *)(local_990.ray + 0x1fc);
                            iVar3 = *(int *)(local_990.hit + 0x84);
                            iVar4 = *(int *)(local_990.hit + 0x88);
                            iVar1 = *(int *)(local_990.hit + 0x8c);
                            iVar66 = *(int *)(local_990.hit + 0x90);
                            iVar67 = *(int *)(local_990.hit + 0x94);
                            iVar68 = *(int *)(local_990.hit + 0x98);
                            iVar69 = *(int *)(local_990.hit + 0x9c);
                            bVar94 = (bool)((byte)(uVar95 >> 1) & 1);
                            bVar17 = (bool)((byte)(uVar95 >> 2) & 1);
                            bVar18 = (bool)((byte)(uVar95 >> 3) & 1);
                            bVar19 = (bool)((byte)(uVar95 >> 4) & 1);
                            bVar20 = (bool)((byte)(uVar95 >> 5) & 1);
                            bVar21 = (bool)((byte)(uVar95 >> 6) & 1);
                            bVar22 = SUB81(uVar95 >> 7,0);
                            *(uint *)(local_990.ray + 0x200) =
                                 (uint)(bVar89 & 1) * *(int *)(local_990.hit + 0x80) |
                                 (uint)!(bool)(bVar89 & 1) * *(int *)(local_990.ray + 0x200);
                            *(uint *)(local_990.ray + 0x204) =
                                 (uint)bVar94 * iVar3 |
                                 (uint)!bVar94 * *(int *)(local_990.ray + 0x204);
                            *(uint *)(local_990.ray + 0x208) =
                                 (uint)bVar17 * iVar4 |
                                 (uint)!bVar17 * *(int *)(local_990.ray + 0x208);
                            *(uint *)(local_990.ray + 0x20c) =
                                 (uint)bVar18 * iVar1 |
                                 (uint)!bVar18 * *(int *)(local_990.ray + 0x20c);
                            *(uint *)(local_990.ray + 0x210) =
                                 (uint)bVar19 * iVar66 |
                                 (uint)!bVar19 * *(int *)(local_990.ray + 0x210);
                            *(uint *)(local_990.ray + 0x214) =
                                 (uint)bVar20 * iVar67 |
                                 (uint)!bVar20 * *(int *)(local_990.ray + 0x214);
                            *(uint *)(local_990.ray + 0x218) =
                                 (uint)bVar21 * iVar68 |
                                 (uint)!bVar21 * *(int *)(local_990.ray + 0x218);
                            *(uint *)(local_990.ray + 0x21c) =
                                 (uint)bVar22 * iVar69 |
                                 (uint)!bVar22 * *(int *)(local_990.ray + 0x21c);
                            auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xa0));
                            *(undefined1 (*) [32])(local_990.ray + 0x220) = auVar112;
                            auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xc0));
                            *(undefined1 (*) [32])(local_990.ray + 0x240) = auVar112;
                            auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0xe0));
                            *(undefined1 (*) [32])(local_990.ray + 0x260) = auVar112;
                            auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_990.hit + 0x100));
                            *(undefined1 (*) [32])(local_990.ray + 0x280) = auVar112;
                            goto LAB_01e9e2b5;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar260;
                      }
                    }
                  }
                }
LAB_01e9e2b5:
                bVar94 = lVar93 != 0;
                lVar93 = lVar93 + -1;
              } while ((!bVar16) && (bVar94));
              auVar77._4_4_ = fStack_6bc;
              auVar77._0_4_ = local_6c0;
              auVar77._8_4_ = fStack_6b8;
              auVar77._12_4_ = fStack_6b4;
              auVar77._16_4_ = fStack_6b0;
              auVar77._20_4_ = fStack_6ac;
              auVar77._24_4_ = fStack_6a8;
              auVar77._28_4_ = fStack_6a4;
              uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar39._4_4_ = uVar162;
              auVar39._0_4_ = uVar162;
              auVar39._8_4_ = uVar162;
              auVar39._12_4_ = uVar162;
              auVar39._16_4_ = uVar162;
              auVar39._20_4_ = uVar162;
              auVar39._24_4_ = uVar162;
              auVar39._28_4_ = uVar162;
              uVar24 = vcmpps_avx512vl(auVar77,auVar39,2);
              bVar90 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar90 & (byte)uVar24;
            } while (bVar90 != 0);
          }
          uVar26 = vpcmpd_avx512vl(local_600,_local_6e0,1);
          uVar25 = vpcmpd_avx512vl(local_600,local_440,1);
          auVar202._0_4_ = (float)local_700._0_4_ + (float)local_1c0._0_4_;
          auVar202._4_4_ = (float)local_700._4_4_ + (float)local_1c0._4_4_;
          auVar202._8_4_ = fStack_6f8 + fStack_1b8;
          auVar202._12_4_ = fStack_6f4 + fStack_1b4;
          auVar202._16_4_ = fStack_6f0 + fStack_1b0;
          auVar202._20_4_ = fStack_6ec + fStack_1ac;
          auVar202._24_4_ = fStack_6e8 + fStack_1a8;
          auVar202._28_4_ = fStack_6e4 + fStack_1a4;
          uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar221._4_4_ = uVar162;
          auVar221._0_4_ = uVar162;
          auVar221._8_4_ = uVar162;
          auVar221._12_4_ = uVar162;
          auVar221._16_4_ = uVar162;
          auVar221._20_4_ = uVar162;
          auVar221._24_4_ = uVar162;
          auVar221._28_4_ = uVar162;
          uVar24 = vcmpps_avx512vl(auVar202,auVar221,2);
          bVar87 = bVar87 & (byte)uVar25 & (byte)uVar24;
          auVar238._0_4_ = (float)local_700._0_4_ + (float)local_480._0_4_;
          auVar238._4_4_ = (float)local_700._4_4_ + (float)local_480._4_4_;
          auVar238._8_4_ = fStack_6f8 + fStack_478;
          auVar238._12_4_ = fStack_6f4 + fStack_474;
          auVar238._16_4_ = fStack_6f0 + fStack_470;
          auVar238._20_4_ = fStack_6ec + fStack_46c;
          auVar238._24_4_ = fStack_6e8 + fStack_468;
          auVar238._28_4_ = fStack_6e4 + fStack_464;
          uVar24 = vcmpps_avx512vl(auVar238,auVar221,2);
          bVar83 = bVar83 & (byte)uVar26 & (byte)uVar24 | bVar87;
          prim = local_910;
          if (bVar83 == 0) {
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar278 = ZEXT3264(auVar112);
          }
          else {
            abStack_180[uVar86 * 0x60] = bVar83;
            bVar16 = (bool)(bVar87 >> 1 & 1);
            bVar94 = (bool)(bVar87 >> 2 & 1);
            bVar17 = (bool)(bVar87 >> 3 & 1);
            bVar18 = (bool)(bVar87 >> 4 & 1);
            bVar19 = (bool)(bVar87 >> 5 & 1);
            auStack_160[uVar86 * 0x18] =
                 (uint)(bVar87 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar87 & 1) * local_480._0_4_;
            auStack_160[uVar86 * 0x18 + 1] =
                 (uint)bVar16 * local_1c0._4_4_ | (uint)!bVar16 * local_480._4_4_;
            auStack_160[uVar86 * 0x18 + 2] =
                 (uint)bVar94 * (int)fStack_1b8 | (uint)!bVar94 * (int)fStack_478;
            auStack_160[uVar86 * 0x18 + 3] =
                 (uint)bVar17 * (int)fStack_1b4 | (uint)!bVar17 * (int)fStack_474;
            auStack_160[uVar86 * 0x18 + 4] =
                 (uint)bVar18 * (int)fStack_1b0 | (uint)!bVar18 * (int)fStack_470;
            auStack_160[uVar86 * 0x18 + 5] =
                 (uint)bVar19 * (int)fStack_1ac | (uint)!bVar19 * (int)fStack_46c;
            auStack_160[uVar86 * 0x18 + 6] =
                 (uint)(bVar87 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar87 >> 6) * (int)fStack_468;
            (&fStack_144)[uVar86 * 0x18] = fStack_464;
            uVar24 = vmovlps_avx(local_930);
            (&uStack_140)[uVar86 * 0xc] = uVar24;
            afStack_138[uVar86 * 0x18] = (float)((int)local_908 + 1);
            uVar86 = (ulong)((int)uVar86 + 1);
            auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar278 = ZEXT3264(auVar112);
          }
        }
      }
    }
    auVar222 = ZEXT1664(local_930);
    do {
      if ((int)uVar86 == 0) {
        uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar41._4_4_ = uVar162;
        auVar41._0_4_ = uVar162;
        auVar41._8_4_ = uVar162;
        auVar41._12_4_ = uVar162;
        auVar41._16_4_ = uVar162;
        auVar41._20_4_ = uVar162;
        auVar41._24_4_ = uVar162;
        auVar41._28_4_ = uVar162;
        uVar24 = vcmpps_avx512vl(local_420,auVar41,2);
        uVar88 = (uint)uVar24 & (uint)local_728 - 1 & (uint)local_728;
        local_728 = (ulong)uVar88;
        if (uVar88 == 0) {
          return;
        }
        goto LAB_01e9bf45;
      }
      uVar95 = (ulong)((int)uVar86 - 1);
      auVar112 = *(undefined1 (*) [32])(auStack_160 + uVar95 * 0x18);
      auVar203._0_4_ = auVar112._0_4_ + (float)local_700._0_4_;
      auVar203._4_4_ = auVar112._4_4_ + (float)local_700._4_4_;
      auVar203._8_4_ = auVar112._8_4_ + fStack_6f8;
      auVar203._12_4_ = auVar112._12_4_ + fStack_6f4;
      auVar203._16_4_ = auVar112._16_4_ + fStack_6f0;
      auVar203._20_4_ = auVar112._20_4_ + fStack_6ec;
      auVar203._24_4_ = auVar112._24_4_ + fStack_6e8;
      auVar203._28_4_ = auVar112._28_4_ + fStack_6e4;
      uVar162 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar40._4_4_ = uVar162;
      auVar40._0_4_ = uVar162;
      auVar40._8_4_ = uVar162;
      auVar40._12_4_ = uVar162;
      auVar40._16_4_ = uVar162;
      auVar40._20_4_ = uVar162;
      auVar40._24_4_ = uVar162;
      auVar40._28_4_ = uVar162;
      uVar24 = vcmpps_avx512vl(auVar203,auVar40,2);
      uVar96 = (uint)uVar24 & (uint)abStack_180[uVar95 * 0x60];
      bVar83 = (byte)uVar96;
      if (uVar96 != 0) {
        auVar204._8_4_ = 0x7f800000;
        auVar204._0_8_ = 0x7f8000007f800000;
        auVar204._12_4_ = 0x7f800000;
        auVar204._16_4_ = 0x7f800000;
        auVar204._20_4_ = 0x7f800000;
        auVar204._24_4_ = 0x7f800000;
        auVar204._28_4_ = 0x7f800000;
        auVar111 = vblendmps_avx512vl(auVar204,auVar112);
        auVar152._0_4_ =
             (uint)(bVar83 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar83 & 1) * (int)auVar112._0_4_;
        bVar16 = (bool)((byte)(uVar96 >> 1) & 1);
        auVar152._4_4_ = (uint)bVar16 * auVar111._4_4_ | (uint)!bVar16 * (int)auVar112._4_4_;
        bVar16 = (bool)((byte)(uVar96 >> 2) & 1);
        auVar152._8_4_ = (uint)bVar16 * auVar111._8_4_ | (uint)!bVar16 * (int)auVar112._8_4_;
        bVar16 = (bool)((byte)(uVar96 >> 3) & 1);
        auVar152._12_4_ = (uint)bVar16 * auVar111._12_4_ | (uint)!bVar16 * (int)auVar112._12_4_;
        bVar16 = (bool)((byte)(uVar96 >> 4) & 1);
        auVar152._16_4_ = (uint)bVar16 * auVar111._16_4_ | (uint)!bVar16 * (int)auVar112._16_4_;
        bVar16 = (bool)((byte)(uVar96 >> 5) & 1);
        auVar152._20_4_ = (uint)bVar16 * auVar111._20_4_ | (uint)!bVar16 * (int)auVar112._20_4_;
        bVar16 = (bool)((byte)(uVar96 >> 6) & 1);
        auVar152._24_4_ = (uint)bVar16 * auVar111._24_4_ | (uint)!bVar16 * (int)auVar112._24_4_;
        auVar152._28_4_ =
             (uVar96 >> 7) * auVar111._28_4_ | (uint)!SUB41(uVar96 >> 7,0) * (int)auVar112._28_4_;
        auVar112 = vshufps_avx(auVar152,auVar152,0xb1);
        auVar112 = vminps_avx(auVar152,auVar112);
        auVar111 = vshufpd_avx(auVar112,auVar112,5);
        auVar112 = vminps_avx(auVar112,auVar111);
        auVar111 = vpermpd_avx2(auVar112,0x4e);
        auVar112 = vminps_avx(auVar112,auVar111);
        uVar24 = vcmpps_avx512vl(auVar152,auVar112,0);
        bVar90 = (byte)uVar24 & bVar83;
        if (bVar90 != 0) {
          uVar96 = (uint)bVar90;
        }
        fVar160 = afStack_138[uVar95 * 0x18 + -1];
        uVar153 = 0;
        for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x80000000) {
          uVar153 = uVar153 + 1;
        }
        local_908 = (ulong)(uint)afStack_138[uVar95 * 0x18];
        bVar90 = ~('\x01' << ((byte)uVar153 & 0x1f)) & bVar83;
        abStack_180[uVar95 * 0x60] = bVar90;
        uVar92 = uVar95;
        if (bVar90 != 0) {
          uVar92 = uVar86;
        }
        fVar258 = *(float *)(&uStack_140 + uVar95 * 0xc);
        auVar205._4_4_ = fVar258;
        auVar205._0_4_ = fVar258;
        auVar205._8_4_ = fVar258;
        auVar205._12_4_ = fVar258;
        auVar205._16_4_ = fVar258;
        auVar205._20_4_ = fVar258;
        auVar205._24_4_ = fVar258;
        auVar205._28_4_ = fVar258;
        fVar160 = fVar160 - fVar258;
        auVar179._4_4_ = fVar160;
        auVar179._0_4_ = fVar160;
        auVar179._8_4_ = fVar160;
        auVar179._12_4_ = fVar160;
        auVar179._16_4_ = fVar160;
        auVar179._20_4_ = fVar160;
        auVar179._24_4_ = fVar160;
        auVar179._28_4_ = fVar160;
        auVar107 = vfmadd132ps_fma(auVar179,auVar205,_DAT_02020f20);
        auVar112 = ZEXT1632(auVar107);
        local_5a0[0] = (RTCHitN)auVar112[0];
        local_5a0[1] = (RTCHitN)auVar112[1];
        local_5a0[2] = (RTCHitN)auVar112[2];
        local_5a0[3] = (RTCHitN)auVar112[3];
        local_5a0[4] = (RTCHitN)auVar112[4];
        local_5a0[5] = (RTCHitN)auVar112[5];
        local_5a0[6] = (RTCHitN)auVar112[6];
        local_5a0[7] = (RTCHitN)auVar112[7];
        local_5a0[8] = (RTCHitN)auVar112[8];
        local_5a0[9] = (RTCHitN)auVar112[9];
        local_5a0[10] = (RTCHitN)auVar112[10];
        local_5a0[0xb] = (RTCHitN)auVar112[0xb];
        local_5a0[0xc] = (RTCHitN)auVar112[0xc];
        local_5a0[0xd] = (RTCHitN)auVar112[0xd];
        local_5a0[0xe] = (RTCHitN)auVar112[0xe];
        local_5a0[0xf] = (RTCHitN)auVar112[0xf];
        local_5a0[0x10] = (RTCHitN)auVar112[0x10];
        local_5a0[0x11] = (RTCHitN)auVar112[0x11];
        local_5a0[0x12] = (RTCHitN)auVar112[0x12];
        local_5a0[0x13] = (RTCHitN)auVar112[0x13];
        local_5a0[0x14] = (RTCHitN)auVar112[0x14];
        local_5a0[0x15] = (RTCHitN)auVar112[0x15];
        local_5a0[0x16] = (RTCHitN)auVar112[0x16];
        local_5a0[0x17] = (RTCHitN)auVar112[0x17];
        local_5a0[0x18] = (RTCHitN)auVar112[0x18];
        local_5a0[0x19] = (RTCHitN)auVar112[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar112[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar112[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar112[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar112[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar112[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar112[0x1f];
        auVar222 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar153 * 4));
        uVar95 = uVar92;
      }
      uVar86 = uVar95;
    } while (bVar83 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }